

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_address.cpp
# Opt level: O0

void __thiscall
AddressFactory_CheckAddressNetType_elements_Test::TestBody
          (AddressFactory_CheckAddressNetType_elements_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  undefined1 uVar14;
  char *pcVar15;
  char *in_R9;
  AssertionResult gtest_ar__55;
  AssertionResult gtest_ar__54;
  AssertionResult gtest_ar__53;
  AssertionResult gtest_ar__52;
  AssertionResult gtest_ar__51;
  AssertionResult gtest_ar__50;
  AssertionResult gtest_ar__49;
  AssertionResult gtest_ar__48;
  AssertionResult gtest_ar__47;
  AssertionResult gtest_ar__46;
  AssertionResult gtest_ar__45;
  AssertionResult gtest_ar__44;
  AssertionResult gtest_ar__43;
  AssertionResult gtest_ar__42;
  AssertionResult gtest_ar__41;
  AssertionResult gtest_ar__40;
  AssertionResult gtest_ar__39;
  AssertionResult gtest_ar__38;
  AssertionResult gtest_ar__37;
  AssertionResult gtest_ar__36;
  AssertionResult gtest_ar__35;
  AssertionResult gtest_ar__34;
  AssertionResult gtest_ar__33;
  AssertionResult gtest_ar__32;
  AssertionResult gtest_ar__31;
  AssertionResult gtest_ar__30;
  AssertionResult gtest_ar__29;
  AssertionResult gtest_ar__28;
  AssertionResult gtest_ar__27;
  AssertionResult gtest_ar__26;
  AssertionResult gtest_ar__25;
  AssertionResult gtest_ar__24;
  AssertionResult gtest_ar__23;
  AssertionResult gtest_ar__22;
  AssertionResult gtest_ar__21;
  AssertionResult gtest_ar__20;
  AssertionResult gtest_ar__19;
  AssertionResult gtest_ar__18;
  AssertionResult gtest_ar__17;
  AssertionResult gtest_ar__16;
  AssertionResult gtest_ar__15;
  AssertionResult gtest_ar__14;
  Script script;
  AssertionResult gtest_ar__13;
  AssertionResult gtest_ar__12;
  AssertionResult gtest_ar__11;
  AssertionResult gtest_ar__10;
  AssertionResult gtest_ar__9;
  AssertionResult gtest_ar__8;
  AssertionResult gtest_ar__7;
  AssertionResult gtest_ar__6;
  AssertionResult gtest_ar__5;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  Address addr;
  Pubkey pubkey;
  AddressFactory factory;
  undefined1 in_stack_ffffffffffffe068;
  undefined1 in_stack_ffffffffffffe069;
  undefined1 in_stack_ffffffffffffe06a;
  undefined1 in_stack_ffffffffffffe06b;
  undefined1 in_stack_ffffffffffffe06c;
  undefined1 in_stack_ffffffffffffe06d;
  undefined1 in_stack_ffffffffffffe06e;
  undefined1 in_stack_ffffffffffffe06f;
  undefined1 in_stack_ffffffffffffe070;
  undefined1 in_stack_ffffffffffffe071;
  undefined1 in_stack_ffffffffffffe072;
  undefined1 in_stack_ffffffffffffe073;
  undefined1 in_stack_ffffffffffffe074;
  undefined1 in_stack_ffffffffffffe075;
  undefined1 in_stack_ffffffffffffe076;
  undefined1 in_stack_ffffffffffffe077;
  undefined1 in_stack_ffffffffffffe078;
  undefined1 in_stack_ffffffffffffe079;
  undefined1 in_stack_ffffffffffffe07a;
  undefined1 in_stack_ffffffffffffe07b;
  undefined1 in_stack_ffffffffffffe07c;
  undefined1 in_stack_ffffffffffffe07d;
  undefined1 in_stack_ffffffffffffe07e;
  undefined1 in_stack_ffffffffffffe07f;
  undefined1 in_stack_ffffffffffffe080;
  undefined1 in_stack_ffffffffffffe081;
  undefined1 in_stack_ffffffffffffe082;
  undefined1 in_stack_ffffffffffffe083;
  undefined1 in_stack_ffffffffffffe084;
  undefined1 in_stack_ffffffffffffe085;
  undefined1 in_stack_ffffffffffffe086;
  undefined1 in_stack_ffffffffffffe087;
  string local_1f00;
  AssertHelper local_1ee0;
  NetType in_stack_ffffffffffffe12c;
  undefined7 in_stack_ffffffffffffe130;
  undefined1 in_stack_ffffffffffffe137;
  AddressFactory *in_stack_ffffffffffffe138;
  string local_1eb8;
  AssertHelper local_1e98;
  Message local_1e90;
  byte local_1e81;
  AssertionResult local_1e80;
  string local_1e70;
  AssertHelper local_1e50;
  Message local_1e48;
  undefined1 local_1e39;
  AssertionResult local_1e38;
  string local_1e28;
  AssertHelper local_1e08;
  Message local_1e00;
  byte local_1df1;
  AssertionResult local_1df0;
  string local_1de0;
  AssertHelper local_1dc0;
  Message local_1db8;
  byte local_1da9;
  AssertionResult local_1da8;
  string local_1d98;
  AssertHelper local_1d78;
  Message local_1d70;
  byte local_1d61;
  AssertionResult local_1d60;
  string local_1d50;
  AssertHelper local_1d30;
  Message local_1d28;
  byte local_1d19;
  AssertionResult local_1d18;
  AssertHelper local_1d08;
  Message local_1d00;
  Address local_1cf8;
  string local_1b78;
  AssertHelper local_1b58;
  Message local_1b50;
  byte local_1b41;
  AssertionResult local_1b40;
  string local_1b30;
  AssertHelper local_1b10;
  Message local_1b08;
  byte local_1af9;
  AssertionResult local_1af8;
  string local_1ae8;
  AssertHelper local_1ac8;
  Message local_1ac0;
  undefined1 local_1ab1;
  AssertionResult local_1ab0;
  string local_1aa0;
  AssertHelper local_1a80;
  Message local_1a78;
  byte local_1a69;
  AssertionResult local_1a68;
  string local_1a58;
  AssertHelper local_1a38;
  Message local_1a30;
  byte local_1a21;
  AssertionResult local_1a20;
  string local_1a10;
  AssertHelper local_19f0;
  Message local_19e8;
  byte local_19d9;
  AssertionResult local_19d8;
  string local_19c8;
  AssertHelper local_19a8;
  Message local_19a0;
  byte local_1991;
  AssertionResult local_1990;
  AssertHelper local_1980;
  Message local_1978;
  Address local_1970;
  string local_17f0;
  AssertHelper local_17d0;
  Message local_17c8;
  byte local_17b9;
  AssertionResult local_17b8;
  string local_17a8;
  AssertHelper local_1788;
  Message local_1780;
  byte local_1771;
  AssertionResult local_1770;
  string local_1760;
  AssertHelper local_1740;
  Message local_1738;
  undefined1 local_1729;
  AssertionResult local_1728;
  string local_1718;
  AssertHelper local_16f8;
  Message local_16f0;
  byte local_16e1;
  AssertionResult local_16e0;
  string local_16d0;
  AssertHelper local_16b0;
  Message local_16a8;
  byte local_1699;
  AssertionResult local_1698;
  string local_1688;
  AssertHelper local_1668;
  Message local_1660;
  byte local_1651;
  AssertionResult local_1650;
  string local_1640;
  AssertHelper local_1620;
  Message local_1618;
  byte local_1609;
  AssertionResult local_1608;
  AssertHelper local_15f8;
  Message local_15f0;
  Address local_15e8;
  string local_1468;
  AssertHelper local_1448;
  Message local_1440;
  byte local_1431;
  AssertionResult local_1430;
  string local_1420;
  AssertHelper local_1400;
  Message local_13f8;
  byte local_13e9;
  AssertionResult local_13e8;
  string local_13d8;
  AssertHelper local_13b8;
  Message local_13b0;
  undefined1 local_13a1;
  AssertionResult local_13a0;
  string local_1390;
  AssertHelper local_1370;
  Message local_1368;
  byte local_1359;
  AssertionResult local_1358;
  string local_1348;
  AssertHelper local_1328;
  Message local_1320;
  byte local_1311;
  AssertionResult local_1310;
  string local_1300;
  AssertHelper local_12e0;
  Message local_12d8;
  byte local_12c9;
  AssertionResult local_12c8;
  string local_12b8;
  AssertHelper local_1298;
  Message local_1290;
  byte local_1281;
  AssertionResult local_1280;
  AssertHelper local_1270;
  Message local_1268;
  Address local_1260;
  string local_10a0;
  AssertHelper local_1080;
  Message local_1078;
  byte local_1069;
  AssertionResult local_1068;
  string local_1058;
  AssertHelper local_1038;
  Message local_1030;
  byte local_1021;
  AssertionResult local_1020;
  string local_1010;
  AssertHelper local_ff0;
  Message local_fe8;
  byte local_fd9;
  AssertionResult local_fd8;
  string local_fc8;
  AssertHelper local_fa8;
  Message local_fa0;
  undefined1 local_f91;
  AssertionResult local_f90;
  string local_f80;
  AssertHelper local_f60;
  Message local_f58;
  byte local_f49;
  AssertionResult local_f48;
  string local_f38;
  AssertHelper local_f18;
  Message local_f10;
  byte local_f01;
  AssertionResult local_f00;
  string local_ef0;
  AssertHelper local_ed0;
  Message local_ec8;
  byte local_eb9;
  AssertionResult local_eb8;
  AssertHelper local_ea8;
  Message local_ea0;
  Address local_e98;
  string local_d18;
  AssertHelper local_cf8;
  Message local_cf0;
  byte local_ce1;
  AssertionResult local_ce0;
  string local_cd0;
  AssertHelper local_cb0;
  Message local_ca8;
  byte local_c99;
  AssertionResult local_c98;
  string local_c88;
  AssertHelper local_c68;
  Message local_c60;
  byte local_c51;
  AssertionResult local_c50;
  string local_c40;
  AssertHelper local_c20;
  Message local_c18;
  undefined1 local_c09;
  AssertionResult local_c08;
  string local_bf8;
  AssertHelper local_bd8;
  Message local_bd0;
  byte local_bc1;
  AssertionResult local_bc0;
  string local_bb0;
  AssertHelper local_b90;
  Message local_b88;
  byte local_b79;
  AssertionResult local_b78;
  string local_b68;
  AssertHelper local_b48;
  Message local_b40;
  byte local_b31;
  AssertionResult local_b30;
  AssertHelper local_b20;
  Message local_b18;
  Address local_b10;
  allocator local_989;
  string local_988;
  Script local_968;
  string local_930;
  AssertHelper local_910;
  Message local_908;
  byte local_8f9;
  AssertionResult local_8f8;
  string local_8e8;
  AssertHelper local_8c8;
  Message local_8c0;
  byte local_8b1;
  AssertionResult local_8b0;
  string local_8a0;
  AssertHelper local_880;
  Message local_878;
  byte local_869;
  AssertionResult local_868;
  string local_858;
  AssertHelper local_838;
  Message local_830;
  undefined1 local_821;
  AssertionResult local_820;
  string local_810;
  AssertHelper local_7f0;
  Message local_7e8;
  byte local_7d9;
  AssertionResult local_7d8;
  string local_7c8;
  AssertHelper local_7a8;
  Message local_7a0;
  byte local_791;
  AssertionResult local_790;
  string local_780;
  AssertHelper local_760;
  Message local_758;
  byte local_749;
  AssertionResult local_748;
  AssertHelper local_738;
  Message local_730;
  Address local_728;
  string local_5a8;
  AssertHelper local_588;
  Message local_580;
  byte local_571;
  AssertionResult local_570;
  string local_560;
  AssertHelper local_540;
  Message local_538;
  byte local_529;
  AssertionResult local_528;
  string local_518;
  AssertHelper local_4f8;
  Message local_4f0;
  byte local_4e1;
  AssertionResult local_4e0;
  string local_4d0;
  AssertHelper local_4b0;
  Message local_4a8;
  undefined1 local_499;
  AssertionResult local_498;
  string local_488;
  AssertHelper local_468;
  Message local_460;
  byte local_451;
  AssertionResult local_450;
  string local_440;
  AssertHelper local_420;
  Message local_418;
  byte local_409;
  AssertionResult local_408;
  string local_3f8;
  AssertHelper local_3d8;
  Message local_3d0;
  byte local_3c1;
  AssertionResult local_3c0;
  AssertHelper local_3b0;
  Message local_3a8 [2];
  Address local_398;
  Address local_218;
  allocator local_91;
  string local_90;
  Pubkey local_70 [4];
  
  cfd::core::GetElementsAddressFormatList();
  cfd::AddressFactory::AddressFactory
            ((AddressFactory *)
             CONCAT17(in_stack_ffffffffffffe077,
                      CONCAT16(in_stack_ffffffffffffe076,
                               CONCAT15(in_stack_ffffffffffffe075,
                                        CONCAT14(in_stack_ffffffffffffe074,
                                                 CONCAT13(in_stack_ffffffffffffe073,
                                                          CONCAT12(in_stack_ffffffffffffe072,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe071,
                                                  in_stack_ffffffffffffe070))))))),
             CONCAT13(in_stack_ffffffffffffe06f,
                      CONCAT12(in_stack_ffffffffffffe06e,
                               CONCAT11(in_stack_ffffffffffffe06d,in_stack_ffffffffffffe06c))),
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             0x1dc26e);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             CONCAT17(in_stack_ffffffffffffe087,
                      CONCAT16(in_stack_ffffffffffffe086,
                               CONCAT15(in_stack_ffffffffffffe085,
                                        CONCAT14(in_stack_ffffffffffffe084,
                                                 CONCAT13(in_stack_ffffffffffffe083,
                                                          CONCAT12(in_stack_ffffffffffffe082,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe081,
                                                  in_stack_ffffffffffffe080))))))));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_90,
             "027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af",&local_91);
  cfd::core::Pubkey::Pubkey(local_70,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  cfd::core::Address::Address(&local_218);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::CreateP2pkhAddress
                ((AddressFactory *)
                 CONCAT17(in_stack_ffffffffffffe07f,
                          CONCAT16(in_stack_ffffffffffffe07e,
                                   CONCAT15(in_stack_ffffffffffffe07d,
                                            CONCAT14(in_stack_ffffffffffffe07c,
                                                     CONCAT13(in_stack_ffffffffffffe07b,
                                                              CONCAT12(in_stack_ffffffffffffe07a,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffe079,
                                                  in_stack_ffffffffffffe078))))))),
                 (Pubkey *)
                 CONCAT17(in_stack_ffffffffffffe077,
                          CONCAT16(in_stack_ffffffffffffe076,
                                   CONCAT15(in_stack_ffffffffffffe075,
                                            CONCAT14(in_stack_ffffffffffffe074,
                                                     CONCAT13(in_stack_ffffffffffffe073,
                                                              CONCAT12(in_stack_ffffffffffffe072,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffe071,
                                                  in_stack_ffffffffffffe070))))))));
      cfd::core::Address::operator=(&local_218,&local_398);
      cfd::core::Address::~Address
                ((Address *)
                 CONCAT17(in_stack_ffffffffffffe077,
                          CONCAT16(in_stack_ffffffffffffe076,
                                   CONCAT15(in_stack_ffffffffffffe075,
                                            CONCAT14(in_stack_ffffffffffffe074,
                                                     CONCAT13(in_stack_ffffffffffffe073,
                                                              CONCAT12(in_stack_ffffffffffffe072,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffe071,
                                                  in_stack_ffffffffffffe070))))))));
    }
  }
  else {
    testing::Message::Message(local_3a8);
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x1c6,
               "Expected: addr = factory.CreateP2pkhAddress(pubkey) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_3b0,local_3a8);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    testing::Message::~Message((Message *)0x1dc4dd);
  }
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    (in_stack_ffffffffffffe138,
                     (Address *)CONCAT17(in_stack_ffffffffffffe137,in_stack_ffffffffffffe130),
                     in_stack_ffffffffffffe12c);
  local_3c1 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe077,
                      CONCAT16(in_stack_ffffffffffffe076,
                               CONCAT15(in_stack_ffffffffffffe075,
                                        CONCAT14(in_stack_ffffffffffffe074,
                                                 CONCAT13(in_stack_ffffffffffffe073,
                                                          CONCAT12(in_stack_ffffffffffffe072,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe071,
                                                  in_stack_ffffffffffffe070))))))),
             (bool *)CONCAT17(in_stack_ffffffffffffe06f,
                              CONCAT16(in_stack_ffffffffffffe06e,
                                       CONCAT15(in_stack_ffffffffffffe06d,
                                                CONCAT14(in_stack_ffffffffffffe06c,
                                                         CONCAT13(in_stack_ffffffffffffe06b,
                                                                  CONCAT12(in_stack_ffffffffffffe06a
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffe069,
                                                  in_stack_ffffffffffffe068))))))),(type *)0x1dc573)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3c0);
  if (!bVar1) {
    testing::Message::Message(&local_3d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_3f8,(internal *)&local_3c0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kMainnet)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x1c7,pcVar15);
    testing::internal::AssertHelper::operator=(&local_3d8,&local_3d0);
    testing::internal::AssertHelper::~AssertHelper(&local_3d8);
    std::__cxx11::string::~string((string *)&local_3f8);
    testing::Message::~Message((Message *)0x1dc65f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1dc6da);
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    (in_stack_ffffffffffffe138,
                     (Address *)CONCAT17(in_stack_ffffffffffffe137,in_stack_ffffffffffffe130),
                     in_stack_ffffffffffffe12c);
  local_409 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe077,
                      CONCAT16(in_stack_ffffffffffffe076,
                               CONCAT15(in_stack_ffffffffffffe075,
                                        CONCAT14(in_stack_ffffffffffffe074,
                                                 CONCAT13(in_stack_ffffffffffffe073,
                                                          CONCAT12(in_stack_ffffffffffffe072,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe071,
                                                  in_stack_ffffffffffffe070))))))),
             (bool *)CONCAT17(in_stack_ffffffffffffe06f,
                              CONCAT16(in_stack_ffffffffffffe06e,
                                       CONCAT15(in_stack_ffffffffffffe06d,
                                                CONCAT14(in_stack_ffffffffffffe06c,
                                                         CONCAT13(in_stack_ffffffffffffe06b,
                                                                  CONCAT12(in_stack_ffffffffffffe06a
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffe069,
                                                  in_stack_ffffffffffffe068))))))),(type *)0x1dc728)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_408);
  if (!bVar1) {
    testing::Message::Message(&local_418);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_440,(internal *)&local_408,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kTestnet)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_420,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x1c8,pcVar15);
    testing::internal::AssertHelper::operator=(&local_420,&local_418);
    testing::internal::AssertHelper::~AssertHelper(&local_420);
    std::__cxx11::string::~string((string *)&local_440);
    testing::Message::~Message((Message *)0x1dc826);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1dc8a1);
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    (in_stack_ffffffffffffe138,
                     (Address *)CONCAT17(in_stack_ffffffffffffe137,in_stack_ffffffffffffe130),
                     in_stack_ffffffffffffe12c);
  local_451 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe077,
                      CONCAT16(in_stack_ffffffffffffe076,
                               CONCAT15(in_stack_ffffffffffffe075,
                                        CONCAT14(in_stack_ffffffffffffe074,
                                                 CONCAT13(in_stack_ffffffffffffe073,
                                                          CONCAT12(in_stack_ffffffffffffe072,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe071,
                                                  in_stack_ffffffffffffe070))))))),
             (bool *)CONCAT17(in_stack_ffffffffffffe06f,
                              CONCAT16(in_stack_ffffffffffffe06e,
                                       CONCAT15(in_stack_ffffffffffffe06d,
                                                CONCAT14(in_stack_ffffffffffffe06c,
                                                         CONCAT13(in_stack_ffffffffffffe06b,
                                                                  CONCAT12(in_stack_ffffffffffffe06a
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffe069,
                                                  in_stack_ffffffffffffe068))))))),(type *)0x1dc8ef)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_450);
  if (!bVar1) {
    testing::Message::Message(&local_460);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_488,(internal *)&local_450,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kRegtest)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_468,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x1c9,pcVar15);
    testing::internal::AssertHelper::operator=(&local_468,&local_460);
    testing::internal::AssertHelper::~AssertHelper(&local_468);
    std::__cxx11::string::~string((string *)&local_488);
    testing::Message::~Message((Message *)0x1dc9ed);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1dca65);
  local_499 = cfd::AddressFactory::CheckAddressNetType
                        (in_stack_ffffffffffffe138,
                         (Address *)CONCAT17(in_stack_ffffffffffffe137,in_stack_ffffffffffffe130),
                         in_stack_ffffffffffffe12c);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe077,
                      CONCAT16(in_stack_ffffffffffffe076,
                               CONCAT15(in_stack_ffffffffffffe075,
                                        CONCAT14(in_stack_ffffffffffffe074,
                                                 CONCAT13(in_stack_ffffffffffffe073,
                                                          CONCAT12(in_stack_ffffffffffffe072,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe071,
                                                  in_stack_ffffffffffffe070))))))),
             (bool *)CONCAT17(in_stack_ffffffffffffe06f,
                              CONCAT16(in_stack_ffffffffffffe06e,
                                       CONCAT15(in_stack_ffffffffffffe06d,
                                                CONCAT14(in_stack_ffffffffffffe06c,
                                                         CONCAT13(in_stack_ffffffffffffe06b,
                                                                  CONCAT12(in_stack_ffffffffffffe06a
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffe069,
                                                  in_stack_ffffffffffffe068))))))),(type *)0x1dcaab)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_498);
  if (!bVar1) {
    testing::Message::Message(&local_4a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_4d0,(internal *)&local_498,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kLiquidV1)","false",
               "true",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_4b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x1ca,pcVar15);
    testing::internal::AssertHelper::operator=(&local_4b0,&local_4a8);
    testing::internal::AssertHelper::~AssertHelper(&local_4b0);
    std::__cxx11::string::~string((string *)&local_4d0);
    testing::Message::~Message((Message *)0x1dcba3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1dcc1b);
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    (in_stack_ffffffffffffe138,
                     (Address *)CONCAT17(in_stack_ffffffffffffe137,in_stack_ffffffffffffe130),
                     in_stack_ffffffffffffe12c);
  local_4e1 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe077,
                      CONCAT16(in_stack_ffffffffffffe076,
                               CONCAT15(in_stack_ffffffffffffe075,
                                        CONCAT14(in_stack_ffffffffffffe074,
                                                 CONCAT13(in_stack_ffffffffffffe073,
                                                          CONCAT12(in_stack_ffffffffffffe072,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe071,
                                                  in_stack_ffffffffffffe070))))))),
             (bool *)CONCAT17(in_stack_ffffffffffffe06f,
                              CONCAT16(in_stack_ffffffffffffe06e,
                                       CONCAT15(in_stack_ffffffffffffe06d,
                                                CONCAT14(in_stack_ffffffffffffe06c,
                                                         CONCAT13(in_stack_ffffffffffffe06b,
                                                                  CONCAT12(in_stack_ffffffffffffe06a
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffe069,
                                                  in_stack_ffffffffffffe068))))))),(type *)0x1dcc63)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4e0);
  if (!bVar1) {
    testing::Message::Message(&local_4f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_518,(internal *)&local_4e0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kElementsRegtest)",
               "true","false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_4f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x1cb,pcVar15);
    testing::internal::AssertHelper::operator=(&local_4f8,&local_4f0);
    testing::internal::AssertHelper::~AssertHelper(&local_4f8);
    std::__cxx11::string::~string((string *)&local_518);
    testing::Message::~Message((Message *)0x1dcd5b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1dcdd3);
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    (in_stack_ffffffffffffe138,
                     (Address *)CONCAT17(in_stack_ffffffffffffe137,in_stack_ffffffffffffe130),
                     in_stack_ffffffffffffe12c);
  local_529 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe077,
                      CONCAT16(in_stack_ffffffffffffe076,
                               CONCAT15(in_stack_ffffffffffffe075,
                                        CONCAT14(in_stack_ffffffffffffe074,
                                                 CONCAT13(in_stack_ffffffffffffe073,
                                                          CONCAT12(in_stack_ffffffffffffe072,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe071,
                                                  in_stack_ffffffffffffe070))))))),
             (bool *)CONCAT17(in_stack_ffffffffffffe06f,
                              CONCAT16(in_stack_ffffffffffffe06e,
                                       CONCAT15(in_stack_ffffffffffffe06d,
                                                CONCAT14(in_stack_ffffffffffffe06c,
                                                         CONCAT13(in_stack_ffffffffffffe06b,
                                                                  CONCAT12(in_stack_ffffffffffffe06a
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffe069,
                                                  in_stack_ffffffffffffe068))))))),(type *)0x1dce1b)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_528);
  if (!bVar1) {
    testing::Message::Message(&local_538);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_560,(internal *)&local_528,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kCustomChain)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_540,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x1cc,pcVar15);
    testing::internal::AssertHelper::operator=(&local_540,&local_538);
    testing::internal::AssertHelper::~AssertHelper(&local_540);
    std::__cxx11::string::~string((string *)&local_560);
    testing::Message::~Message((Message *)0x1dcf13);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1dcf8b);
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    (in_stack_ffffffffffffe138,
                     (Address *)CONCAT17(in_stack_ffffffffffffe137,in_stack_ffffffffffffe130),
                     in_stack_ffffffffffffe12c);
  local_571 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe077,
                      CONCAT16(in_stack_ffffffffffffe076,
                               CONCAT15(in_stack_ffffffffffffe075,
                                        CONCAT14(in_stack_ffffffffffffe074,
                                                 CONCAT13(in_stack_ffffffffffffe073,
                                                          CONCAT12(in_stack_ffffffffffffe072,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe071,
                                                  in_stack_ffffffffffffe070))))))),
             (bool *)CONCAT17(in_stack_ffffffffffffe06f,
                              CONCAT16(in_stack_ffffffffffffe06e,
                                       CONCAT15(in_stack_ffffffffffffe06d,
                                                CONCAT14(in_stack_ffffffffffffe06c,
                                                         CONCAT13(in_stack_ffffffffffffe06b,
                                                                  CONCAT12(in_stack_ffffffffffffe06a
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffe069,
                                                  in_stack_ffffffffffffe068))))))),(type *)0x1dcfd3)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_570);
  if (!bVar1) {
    testing::Message::Message(&local_580);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_5a8,(internal *)&local_570,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kNetTypeNum)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_588,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x1cd,pcVar15);
    testing::internal::AssertHelper::operator=(&local_588,&local_580);
    testing::internal::AssertHelper::~AssertHelper(&local_588);
    std::__cxx11::string::~string((string *)&local_5a8);
    testing::Message::~Message((Message *)0x1dd0cb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1dd146);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::CreateP2wpkhAddress
                ((AddressFactory *)
                 CONCAT17(in_stack_ffffffffffffe07f,
                          CONCAT16(in_stack_ffffffffffffe07e,
                                   CONCAT15(in_stack_ffffffffffffe07d,
                                            CONCAT14(in_stack_ffffffffffffe07c,
                                                     CONCAT13(in_stack_ffffffffffffe07b,
                                                              CONCAT12(in_stack_ffffffffffffe07a,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffe079,
                                                  in_stack_ffffffffffffe078))))))),
                 (Pubkey *)
                 CONCAT17(in_stack_ffffffffffffe077,
                          CONCAT16(in_stack_ffffffffffffe076,
                                   CONCAT15(in_stack_ffffffffffffe075,
                                            CONCAT14(in_stack_ffffffffffffe074,
                                                     CONCAT13(in_stack_ffffffffffffe073,
                                                              CONCAT12(in_stack_ffffffffffffe072,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffe071,
                                                  in_stack_ffffffffffffe070))))))));
      cfd::core::Address::operator=(&local_218,&local_728);
      cfd::core::Address::~Address
                ((Address *)
                 CONCAT17(in_stack_ffffffffffffe077,
                          CONCAT16(in_stack_ffffffffffffe076,
                                   CONCAT15(in_stack_ffffffffffffe075,
                                            CONCAT14(in_stack_ffffffffffffe074,
                                                     CONCAT13(in_stack_ffffffffffffe073,
                                                              CONCAT12(in_stack_ffffffffffffe072,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffe071,
                                                  in_stack_ffffffffffffe070))))))));
    }
  }
  else {
    testing::Message::Message(&local_730);
    testing::internal::AssertHelper::AssertHelper
              (&local_738,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x1cf,
               "Expected: addr = factory.CreateP2wpkhAddress(pubkey) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_738,&local_730);
    testing::internal::AssertHelper::~AssertHelper(&local_738);
    testing::Message::~Message((Message *)0x1dd295);
  }
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    (in_stack_ffffffffffffe138,
                     (Address *)CONCAT17(in_stack_ffffffffffffe137,in_stack_ffffffffffffe130),
                     in_stack_ffffffffffffe12c);
  local_749 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe077,
                      CONCAT16(in_stack_ffffffffffffe076,
                               CONCAT15(in_stack_ffffffffffffe075,
                                        CONCAT14(in_stack_ffffffffffffe074,
                                                 CONCAT13(in_stack_ffffffffffffe073,
                                                          CONCAT12(in_stack_ffffffffffffe072,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe071,
                                                  in_stack_ffffffffffffe070))))))),
             (bool *)CONCAT17(in_stack_ffffffffffffe06f,
                              CONCAT16(in_stack_ffffffffffffe06e,
                                       CONCAT15(in_stack_ffffffffffffe06d,
                                                CONCAT14(in_stack_ffffffffffffe06c,
                                                         CONCAT13(in_stack_ffffffffffffe06b,
                                                                  CONCAT12(in_stack_ffffffffffffe06a
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffe069,
                                                  in_stack_ffffffffffffe068))))))),(type *)0x1dd325)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_748);
  if (!bVar1) {
    testing::Message::Message(&local_758);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_780,(internal *)&local_748,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kMainnet)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_760,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x1d0,pcVar15);
    testing::internal::AssertHelper::operator=(&local_760,&local_758);
    testing::internal::AssertHelper::~AssertHelper(&local_760);
    std::__cxx11::string::~string((string *)&local_780);
    testing::Message::~Message((Message *)0x1dd40b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1dd483);
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    (in_stack_ffffffffffffe138,
                     (Address *)CONCAT17(in_stack_ffffffffffffe137,in_stack_ffffffffffffe130),
                     in_stack_ffffffffffffe12c);
  local_791 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe077,
                      CONCAT16(in_stack_ffffffffffffe076,
                               CONCAT15(in_stack_ffffffffffffe075,
                                        CONCAT14(in_stack_ffffffffffffe074,
                                                 CONCAT13(in_stack_ffffffffffffe073,
                                                          CONCAT12(in_stack_ffffffffffffe072,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe071,
                                                  in_stack_ffffffffffffe070))))))),
             (bool *)CONCAT17(in_stack_ffffffffffffe06f,
                              CONCAT16(in_stack_ffffffffffffe06e,
                                       CONCAT15(in_stack_ffffffffffffe06d,
                                                CONCAT14(in_stack_ffffffffffffe06c,
                                                         CONCAT13(in_stack_ffffffffffffe06b,
                                                                  CONCAT12(in_stack_ffffffffffffe06a
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffe069,
                                                  in_stack_ffffffffffffe068))))))),(type *)0x1dd4cb)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_790);
  if (!bVar1) {
    testing::Message::Message(&local_7a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_7c8,(internal *)&local_790,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kTestnet)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_7a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x1d1,pcVar15);
    testing::internal::AssertHelper::operator=(&local_7a8,&local_7a0);
    testing::internal::AssertHelper::~AssertHelper(&local_7a8);
    std::__cxx11::string::~string((string *)&local_7c8);
    testing::Message::~Message((Message *)0x1dd5c3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1dd63b);
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    (in_stack_ffffffffffffe138,
                     (Address *)CONCAT17(in_stack_ffffffffffffe137,in_stack_ffffffffffffe130),
                     in_stack_ffffffffffffe12c);
  local_7d9 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe077,
                      CONCAT16(in_stack_ffffffffffffe076,
                               CONCAT15(in_stack_ffffffffffffe075,
                                        CONCAT14(in_stack_ffffffffffffe074,
                                                 CONCAT13(in_stack_ffffffffffffe073,
                                                          CONCAT12(in_stack_ffffffffffffe072,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe071,
                                                  in_stack_ffffffffffffe070))))))),
             (bool *)CONCAT17(in_stack_ffffffffffffe06f,
                              CONCAT16(in_stack_ffffffffffffe06e,
                                       CONCAT15(in_stack_ffffffffffffe06d,
                                                CONCAT14(in_stack_ffffffffffffe06c,
                                                         CONCAT13(in_stack_ffffffffffffe06b,
                                                                  CONCAT12(in_stack_ffffffffffffe06a
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffe069,
                                                  in_stack_ffffffffffffe068))))))),(type *)0x1dd683)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_7d8);
  if (!bVar1) {
    testing::Message::Message(&local_7e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_810,(internal *)&local_7d8,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kRegtest)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_7f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x1d2,pcVar15);
    testing::internal::AssertHelper::operator=(&local_7f0,&local_7e8);
    testing::internal::AssertHelper::~AssertHelper(&local_7f0);
    std::__cxx11::string::~string((string *)&local_810);
    testing::Message::~Message((Message *)0x1dd77b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1dd7f3);
  local_821 = cfd::AddressFactory::CheckAddressNetType
                        (in_stack_ffffffffffffe138,
                         (Address *)CONCAT17(in_stack_ffffffffffffe137,in_stack_ffffffffffffe130),
                         in_stack_ffffffffffffe12c);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe077,
                      CONCAT16(in_stack_ffffffffffffe076,
                               CONCAT15(in_stack_ffffffffffffe075,
                                        CONCAT14(in_stack_ffffffffffffe074,
                                                 CONCAT13(in_stack_ffffffffffffe073,
                                                          CONCAT12(in_stack_ffffffffffffe072,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe071,
                                                  in_stack_ffffffffffffe070))))))),
             (bool *)CONCAT17(in_stack_ffffffffffffe06f,
                              CONCAT16(in_stack_ffffffffffffe06e,
                                       CONCAT15(in_stack_ffffffffffffe06d,
                                                CONCAT14(in_stack_ffffffffffffe06c,
                                                         CONCAT13(in_stack_ffffffffffffe06b,
                                                                  CONCAT12(in_stack_ffffffffffffe06a
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffe069,
                                                  in_stack_ffffffffffffe068))))))),(type *)0x1dd839)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_820);
  if (!bVar1) {
    testing::Message::Message(&local_830);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_858,(internal *)&local_820,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kLiquidV1)","false",
               "true",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_838,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x1d3,pcVar15);
    testing::internal::AssertHelper::operator=(&local_838,&local_830);
    testing::internal::AssertHelper::~AssertHelper(&local_838);
    std::__cxx11::string::~string((string *)&local_858);
    testing::Message::~Message((Message *)0x1dd931);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1dd9a9);
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    (in_stack_ffffffffffffe138,
                     (Address *)CONCAT17(in_stack_ffffffffffffe137,in_stack_ffffffffffffe130),
                     in_stack_ffffffffffffe12c);
  local_869 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe077,
                      CONCAT16(in_stack_ffffffffffffe076,
                               CONCAT15(in_stack_ffffffffffffe075,
                                        CONCAT14(in_stack_ffffffffffffe074,
                                                 CONCAT13(in_stack_ffffffffffffe073,
                                                          CONCAT12(in_stack_ffffffffffffe072,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe071,
                                                  in_stack_ffffffffffffe070))))))),
             (bool *)CONCAT17(in_stack_ffffffffffffe06f,
                              CONCAT16(in_stack_ffffffffffffe06e,
                                       CONCAT15(in_stack_ffffffffffffe06d,
                                                CONCAT14(in_stack_ffffffffffffe06c,
                                                         CONCAT13(in_stack_ffffffffffffe06b,
                                                                  CONCAT12(in_stack_ffffffffffffe06a
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffe069,
                                                  in_stack_ffffffffffffe068))))))),(type *)0x1dd9f1)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_868);
  if (!bVar1) {
    testing::Message::Message(&local_878);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_8a0,(internal *)&local_868,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kElementsRegtest)",
               "true","false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_880,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x1d4,pcVar15);
    testing::internal::AssertHelper::operator=(&local_880,&local_878);
    testing::internal::AssertHelper::~AssertHelper(&local_880);
    std::__cxx11::string::~string((string *)&local_8a0);
    testing::Message::~Message((Message *)0x1ddae9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1ddb61);
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    (in_stack_ffffffffffffe138,
                     (Address *)CONCAT17(in_stack_ffffffffffffe137,in_stack_ffffffffffffe130),
                     in_stack_ffffffffffffe12c);
  local_8b1 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe077,
                      CONCAT16(in_stack_ffffffffffffe076,
                               CONCAT15(in_stack_ffffffffffffe075,
                                        CONCAT14(in_stack_ffffffffffffe074,
                                                 CONCAT13(in_stack_ffffffffffffe073,
                                                          CONCAT12(in_stack_ffffffffffffe072,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe071,
                                                  in_stack_ffffffffffffe070))))))),
             (bool *)CONCAT17(in_stack_ffffffffffffe06f,
                              CONCAT16(in_stack_ffffffffffffe06e,
                                       CONCAT15(in_stack_ffffffffffffe06d,
                                                CONCAT14(in_stack_ffffffffffffe06c,
                                                         CONCAT13(in_stack_ffffffffffffe06b,
                                                                  CONCAT12(in_stack_ffffffffffffe06a
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffe069,
                                                  in_stack_ffffffffffffe068))))))),(type *)0x1ddba9)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_8b0);
  if (!bVar1) {
    testing::Message::Message(&local_8c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_8e8,(internal *)&local_8b0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kCustomChain)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_8c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x1d5,pcVar15);
    testing::internal::AssertHelper::operator=(&local_8c8,&local_8c0);
    testing::internal::AssertHelper::~AssertHelper(&local_8c8);
    std::__cxx11::string::~string((string *)&local_8e8);
    testing::Message::~Message((Message *)0x1ddca1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1ddd19);
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    (in_stack_ffffffffffffe138,
                     (Address *)CONCAT17(in_stack_ffffffffffffe137,in_stack_ffffffffffffe130),
                     in_stack_ffffffffffffe12c);
  local_8f9 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe077,
                      CONCAT16(in_stack_ffffffffffffe076,
                               CONCAT15(in_stack_ffffffffffffe075,
                                        CONCAT14(in_stack_ffffffffffffe074,
                                                 CONCAT13(in_stack_ffffffffffffe073,
                                                          CONCAT12(in_stack_ffffffffffffe072,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe071,
                                                  in_stack_ffffffffffffe070))))))),
             (bool *)CONCAT17(in_stack_ffffffffffffe06f,
                              CONCAT16(in_stack_ffffffffffffe06e,
                                       CONCAT15(in_stack_ffffffffffffe06d,
                                                CONCAT14(in_stack_ffffffffffffe06c,
                                                         CONCAT13(in_stack_ffffffffffffe06b,
                                                                  CONCAT12(in_stack_ffffffffffffe06a
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffe069,
                                                  in_stack_ffffffffffffe068))))))),(type *)0x1ddd61)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_8f8);
  if (!bVar1) {
    testing::Message::Message(&local_908);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_930,(internal *)&local_8f8,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kNetTypeNum)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_910,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x1d6,pcVar15);
    testing::internal::AssertHelper::operator=(&local_910,&local_908);
    testing::internal::AssertHelper::~AssertHelper(&local_910);
    std::__cxx11::string::~string((string *)&local_930);
    testing::Message::~Message((Message *)0x1dde59);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1dded4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_988,"76a914ef286e6af39de178d88b32e120f716b53753808c88ac",&local_989);
  cfd::core::Script::Script(&local_968,&local_988);
  std::__cxx11::string::~string((string *)&local_988);
  std::allocator<char>::~allocator((allocator<char> *)&local_989);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::CreateP2shAddress
                ((AddressFactory *)
                 CONCAT17(in_stack_ffffffffffffe07f,
                          CONCAT16(in_stack_ffffffffffffe07e,
                                   CONCAT15(in_stack_ffffffffffffe07d,
                                            CONCAT14(in_stack_ffffffffffffe07c,
                                                     CONCAT13(in_stack_ffffffffffffe07b,
                                                              CONCAT12(in_stack_ffffffffffffe07a,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffe079,
                                                  in_stack_ffffffffffffe078))))))),
                 (Script *)
                 CONCAT17(in_stack_ffffffffffffe077,
                          CONCAT16(in_stack_ffffffffffffe076,
                                   CONCAT15(in_stack_ffffffffffffe075,
                                            CONCAT14(in_stack_ffffffffffffe074,
                                                     CONCAT13(in_stack_ffffffffffffe073,
                                                              CONCAT12(in_stack_ffffffffffffe072,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffe071,
                                                  in_stack_ffffffffffffe070))))))));
      cfd::core::Address::operator=(&local_218,&local_b10);
      cfd::core::Address::~Address
                ((Address *)
                 CONCAT17(in_stack_ffffffffffffe077,
                          CONCAT16(in_stack_ffffffffffffe076,
                                   CONCAT15(in_stack_ffffffffffffe075,
                                            CONCAT14(in_stack_ffffffffffffe074,
                                                     CONCAT13(in_stack_ffffffffffffe073,
                                                              CONCAT12(in_stack_ffffffffffffe072,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffe071,
                                                  in_stack_ffffffffffffe070))))))));
    }
  }
  else {
    testing::Message::Message(&local_b18);
    testing::internal::AssertHelper::AssertHelper
              (&local_b20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x1d9,
               "Expected: addr = factory.CreateP2shAddress(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_b20,&local_b18);
    testing::internal::AssertHelper::~AssertHelper(&local_b20);
    testing::Message::~Message((Message *)0x1de0e6);
  }
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    (in_stack_ffffffffffffe138,
                     (Address *)CONCAT17(in_stack_ffffffffffffe137,in_stack_ffffffffffffe130),
                     in_stack_ffffffffffffe12c);
  local_b31 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe077,
                      CONCAT16(in_stack_ffffffffffffe076,
                               CONCAT15(in_stack_ffffffffffffe075,
                                        CONCAT14(in_stack_ffffffffffffe074,
                                                 CONCAT13(in_stack_ffffffffffffe073,
                                                          CONCAT12(in_stack_ffffffffffffe072,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe071,
                                                  in_stack_ffffffffffffe070))))))),
             (bool *)CONCAT17(in_stack_ffffffffffffe06f,
                              CONCAT16(in_stack_ffffffffffffe06e,
                                       CONCAT15(in_stack_ffffffffffffe06d,
                                                CONCAT14(in_stack_ffffffffffffe06c,
                                                         CONCAT13(in_stack_ffffffffffffe06b,
                                                                  CONCAT12(in_stack_ffffffffffffe06a
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffe069,
                                                  in_stack_ffffffffffffe068))))))),(type *)0x1de176)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_b30);
  if (!bVar1) {
    testing::Message::Message(&local_b40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b68,(internal *)&local_b30,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kMainnet)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x1da,pcVar15);
    testing::internal::AssertHelper::operator=(&local_b48,&local_b40);
    testing::internal::AssertHelper::~AssertHelper(&local_b48);
    std::__cxx11::string::~string((string *)&local_b68);
    testing::Message::~Message((Message *)0x1de25c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1de2d4);
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    (in_stack_ffffffffffffe138,
                     (Address *)CONCAT17(in_stack_ffffffffffffe137,in_stack_ffffffffffffe130),
                     in_stack_ffffffffffffe12c);
  local_b79 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe077,
                      CONCAT16(in_stack_ffffffffffffe076,
                               CONCAT15(in_stack_ffffffffffffe075,
                                        CONCAT14(in_stack_ffffffffffffe074,
                                                 CONCAT13(in_stack_ffffffffffffe073,
                                                          CONCAT12(in_stack_ffffffffffffe072,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe071,
                                                  in_stack_ffffffffffffe070))))))),
             (bool *)CONCAT17(in_stack_ffffffffffffe06f,
                              CONCAT16(in_stack_ffffffffffffe06e,
                                       CONCAT15(in_stack_ffffffffffffe06d,
                                                CONCAT14(in_stack_ffffffffffffe06c,
                                                         CONCAT13(in_stack_ffffffffffffe06b,
                                                                  CONCAT12(in_stack_ffffffffffffe06a
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffe069,
                                                  in_stack_ffffffffffffe068))))))),(type *)0x1de31c)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_b78);
  if (!bVar1) {
    testing::Message::Message(&local_b88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_bb0,(internal *)&local_b78,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kTestnet)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x1db,pcVar15);
    testing::internal::AssertHelper::operator=(&local_b90,&local_b88);
    testing::internal::AssertHelper::~AssertHelper(&local_b90);
    std::__cxx11::string::~string((string *)&local_bb0);
    testing::Message::~Message((Message *)0x1de414);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1de48c);
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    (in_stack_ffffffffffffe138,
                     (Address *)CONCAT17(in_stack_ffffffffffffe137,in_stack_ffffffffffffe130),
                     in_stack_ffffffffffffe12c);
  local_bc1 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe077,
                      CONCAT16(in_stack_ffffffffffffe076,
                               CONCAT15(in_stack_ffffffffffffe075,
                                        CONCAT14(in_stack_ffffffffffffe074,
                                                 CONCAT13(in_stack_ffffffffffffe073,
                                                          CONCAT12(in_stack_ffffffffffffe072,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe071,
                                                  in_stack_ffffffffffffe070))))))),
             (bool *)CONCAT17(in_stack_ffffffffffffe06f,
                              CONCAT16(in_stack_ffffffffffffe06e,
                                       CONCAT15(in_stack_ffffffffffffe06d,
                                                CONCAT14(in_stack_ffffffffffffe06c,
                                                         CONCAT13(in_stack_ffffffffffffe06b,
                                                                  CONCAT12(in_stack_ffffffffffffe06a
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffe069,
                                                  in_stack_ffffffffffffe068))))))),(type *)0x1de4d4)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_bc0);
  if (!bVar1) {
    testing::Message::Message(&local_bd0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_bf8,(internal *)&local_bc0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kRegtest)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_bd8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x1dc,pcVar15);
    testing::internal::AssertHelper::operator=(&local_bd8,&local_bd0);
    testing::internal::AssertHelper::~AssertHelper(&local_bd8);
    std::__cxx11::string::~string((string *)&local_bf8);
    testing::Message::~Message((Message *)0x1de5cc);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1de644);
  local_c09 = cfd::AddressFactory::CheckAddressNetType
                        (in_stack_ffffffffffffe138,
                         (Address *)CONCAT17(in_stack_ffffffffffffe137,in_stack_ffffffffffffe130),
                         in_stack_ffffffffffffe12c);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe077,
                      CONCAT16(in_stack_ffffffffffffe076,
                               CONCAT15(in_stack_ffffffffffffe075,
                                        CONCAT14(in_stack_ffffffffffffe074,
                                                 CONCAT13(in_stack_ffffffffffffe073,
                                                          CONCAT12(in_stack_ffffffffffffe072,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe071,
                                                  in_stack_ffffffffffffe070))))))),
             (bool *)CONCAT17(in_stack_ffffffffffffe06f,
                              CONCAT16(in_stack_ffffffffffffe06e,
                                       CONCAT15(in_stack_ffffffffffffe06d,
                                                CONCAT14(in_stack_ffffffffffffe06c,
                                                         CONCAT13(in_stack_ffffffffffffe06b,
                                                                  CONCAT12(in_stack_ffffffffffffe06a
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffe069,
                                                  in_stack_ffffffffffffe068))))))),(type *)0x1de68a)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c08);
  if (!bVar1) {
    testing::Message::Message(&local_c18);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_c40,(internal *)&local_c08,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kLiquidV1)","false",
               "true",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x1dd,pcVar15);
    testing::internal::AssertHelper::operator=(&local_c20,&local_c18);
    testing::internal::AssertHelper::~AssertHelper(&local_c20);
    std::__cxx11::string::~string((string *)&local_c40);
    testing::Message::~Message((Message *)0x1de782);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1de7fa);
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    (in_stack_ffffffffffffe138,
                     (Address *)CONCAT17(in_stack_ffffffffffffe137,in_stack_ffffffffffffe130),
                     in_stack_ffffffffffffe12c);
  local_c51 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe077,
                      CONCAT16(in_stack_ffffffffffffe076,
                               CONCAT15(in_stack_ffffffffffffe075,
                                        CONCAT14(in_stack_ffffffffffffe074,
                                                 CONCAT13(in_stack_ffffffffffffe073,
                                                          CONCAT12(in_stack_ffffffffffffe072,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe071,
                                                  in_stack_ffffffffffffe070))))))),
             (bool *)CONCAT17(in_stack_ffffffffffffe06f,
                              CONCAT16(in_stack_ffffffffffffe06e,
                                       CONCAT15(in_stack_ffffffffffffe06d,
                                                CONCAT14(in_stack_ffffffffffffe06c,
                                                         CONCAT13(in_stack_ffffffffffffe06b,
                                                                  CONCAT12(in_stack_ffffffffffffe06a
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffe069,
                                                  in_stack_ffffffffffffe068))))))),(type *)0x1de842)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c50);
  if (!bVar1) {
    testing::Message::Message(&local_c60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_c88,(internal *)&local_c50,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kElementsRegtest)",
               "true","false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x1de,pcVar15);
    testing::internal::AssertHelper::operator=(&local_c68,&local_c60);
    testing::internal::AssertHelper::~AssertHelper(&local_c68);
    std::__cxx11::string::~string((string *)&local_c88);
    testing::Message::~Message((Message *)0x1de93a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1de9b2);
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    (in_stack_ffffffffffffe138,
                     (Address *)CONCAT17(in_stack_ffffffffffffe137,in_stack_ffffffffffffe130),
                     in_stack_ffffffffffffe12c);
  local_c99 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe077,
                      CONCAT16(in_stack_ffffffffffffe076,
                               CONCAT15(in_stack_ffffffffffffe075,
                                        CONCAT14(in_stack_ffffffffffffe074,
                                                 CONCAT13(in_stack_ffffffffffffe073,
                                                          CONCAT12(in_stack_ffffffffffffe072,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe071,
                                                  in_stack_ffffffffffffe070))))))),
             (bool *)CONCAT17(in_stack_ffffffffffffe06f,
                              CONCAT16(in_stack_ffffffffffffe06e,
                                       CONCAT15(in_stack_ffffffffffffe06d,
                                                CONCAT14(in_stack_ffffffffffffe06c,
                                                         CONCAT13(in_stack_ffffffffffffe06b,
                                                                  CONCAT12(in_stack_ffffffffffffe06a
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffe069,
                                                  in_stack_ffffffffffffe068))))))),(type *)0x1de9fa)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c98);
  if (!bVar1) {
    testing::Message::Message(&local_ca8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_cd0,(internal *)&local_c98,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kCustomChain)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_cb0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x1df,pcVar15);
    testing::internal::AssertHelper::operator=(&local_cb0,&local_ca8);
    testing::internal::AssertHelper::~AssertHelper(&local_cb0);
    std::__cxx11::string::~string((string *)&local_cd0);
    testing::Message::~Message((Message *)0x1deaf2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1deb6a);
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    (in_stack_ffffffffffffe138,
                     (Address *)CONCAT17(in_stack_ffffffffffffe137,in_stack_ffffffffffffe130),
                     in_stack_ffffffffffffe12c);
  local_ce1 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe077,
                      CONCAT16(in_stack_ffffffffffffe076,
                               CONCAT15(in_stack_ffffffffffffe075,
                                        CONCAT14(in_stack_ffffffffffffe074,
                                                 CONCAT13(in_stack_ffffffffffffe073,
                                                          CONCAT12(in_stack_ffffffffffffe072,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe071,
                                                  in_stack_ffffffffffffe070))))))),
             (bool *)CONCAT17(in_stack_ffffffffffffe06f,
                              CONCAT16(in_stack_ffffffffffffe06e,
                                       CONCAT15(in_stack_ffffffffffffe06d,
                                                CONCAT14(in_stack_ffffffffffffe06c,
                                                         CONCAT13(in_stack_ffffffffffffe06b,
                                                                  CONCAT12(in_stack_ffffffffffffe06a
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffe069,
                                                  in_stack_ffffffffffffe068))))))),(type *)0x1debb2)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_ce0);
  if (!bVar1) {
    testing::Message::Message(&local_cf0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_d18,(internal *)&local_ce0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kNetTypeNum)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_cf8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x1e0,pcVar15);
    testing::internal::AssertHelper::operator=(&local_cf8,&local_cf0);
    testing::internal::AssertHelper::~AssertHelper(&local_cf8);
    std::__cxx11::string::~string((string *)&local_d18);
    testing::Message::~Message((Message *)0x1decaa);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1ded25);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::CreateP2wshAddress
                ((AddressFactory *)
                 CONCAT17(in_stack_ffffffffffffe07f,
                          CONCAT16(in_stack_ffffffffffffe07e,
                                   CONCAT15(in_stack_ffffffffffffe07d,
                                            CONCAT14(in_stack_ffffffffffffe07c,
                                                     CONCAT13(in_stack_ffffffffffffe07b,
                                                              CONCAT12(in_stack_ffffffffffffe07a,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffe079,
                                                  in_stack_ffffffffffffe078))))))),
                 (Script *)
                 CONCAT17(in_stack_ffffffffffffe077,
                          CONCAT16(in_stack_ffffffffffffe076,
                                   CONCAT15(in_stack_ffffffffffffe075,
                                            CONCAT14(in_stack_ffffffffffffe074,
                                                     CONCAT13(in_stack_ffffffffffffe073,
                                                              CONCAT12(in_stack_ffffffffffffe072,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffe071,
                                                  in_stack_ffffffffffffe070))))))));
      cfd::core::Address::operator=(&local_218,&local_e98);
      cfd::core::Address::~Address
                ((Address *)
                 CONCAT17(in_stack_ffffffffffffe077,
                          CONCAT16(in_stack_ffffffffffffe076,
                                   CONCAT15(in_stack_ffffffffffffe075,
                                            CONCAT14(in_stack_ffffffffffffe074,
                                                     CONCAT13(in_stack_ffffffffffffe073,
                                                              CONCAT12(in_stack_ffffffffffffe072,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffe071,
                                                  in_stack_ffffffffffffe070))))))));
    }
  }
  else {
    testing::Message::Message(&local_ea0);
    testing::internal::AssertHelper::AssertHelper
              (&local_ea8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x1e2,
               "Expected: addr = factory.CreateP2wshAddress(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_ea8,&local_ea0);
    testing::internal::AssertHelper::~AssertHelper(&local_ea8);
    testing::Message::~Message((Message *)0x1dee74);
  }
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    (in_stack_ffffffffffffe138,
                     (Address *)CONCAT17(in_stack_ffffffffffffe137,in_stack_ffffffffffffe130),
                     in_stack_ffffffffffffe12c);
  local_eb9 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe077,
                      CONCAT16(in_stack_ffffffffffffe076,
                               CONCAT15(in_stack_ffffffffffffe075,
                                        CONCAT14(in_stack_ffffffffffffe074,
                                                 CONCAT13(in_stack_ffffffffffffe073,
                                                          CONCAT12(in_stack_ffffffffffffe072,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe071,
                                                  in_stack_ffffffffffffe070))))))),
             (bool *)CONCAT17(in_stack_ffffffffffffe06f,
                              CONCAT16(in_stack_ffffffffffffe06e,
                                       CONCAT15(in_stack_ffffffffffffe06d,
                                                CONCAT14(in_stack_ffffffffffffe06c,
                                                         CONCAT13(in_stack_ffffffffffffe06b,
                                                                  CONCAT12(in_stack_ffffffffffffe06a
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffe069,
                                                  in_stack_ffffffffffffe068))))))),(type *)0x1def04)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_eb8);
  if (!bVar1) {
    testing::Message::Message(&local_ec8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_ef0,(internal *)&local_eb8,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kMainnet)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_ed0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x1e3,pcVar15);
    testing::internal::AssertHelper::operator=(&local_ed0,&local_ec8);
    testing::internal::AssertHelper::~AssertHelper(&local_ed0);
    std::__cxx11::string::~string((string *)&local_ef0);
    testing::Message::~Message((Message *)0x1defea);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1df062);
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    (in_stack_ffffffffffffe138,
                     (Address *)CONCAT17(in_stack_ffffffffffffe137,in_stack_ffffffffffffe130),
                     in_stack_ffffffffffffe12c);
  local_f01 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe077,
                      CONCAT16(in_stack_ffffffffffffe076,
                               CONCAT15(in_stack_ffffffffffffe075,
                                        CONCAT14(in_stack_ffffffffffffe074,
                                                 CONCAT13(in_stack_ffffffffffffe073,
                                                          CONCAT12(in_stack_ffffffffffffe072,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe071,
                                                  in_stack_ffffffffffffe070))))))),
             (bool *)CONCAT17(in_stack_ffffffffffffe06f,
                              CONCAT16(in_stack_ffffffffffffe06e,
                                       CONCAT15(in_stack_ffffffffffffe06d,
                                                CONCAT14(in_stack_ffffffffffffe06c,
                                                         CONCAT13(in_stack_ffffffffffffe06b,
                                                                  CONCAT12(in_stack_ffffffffffffe06a
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffe069,
                                                  in_stack_ffffffffffffe068))))))),(type *)0x1df0aa)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f00);
  if (!bVar1) {
    testing::Message::Message(&local_f10);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_f38,(internal *)&local_f00,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kTestnet)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_f18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x1e4,pcVar15);
    testing::internal::AssertHelper::operator=(&local_f18,&local_f10);
    testing::internal::AssertHelper::~AssertHelper(&local_f18);
    std::__cxx11::string::~string((string *)&local_f38);
    testing::Message::~Message((Message *)0x1df1a2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1df21a);
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    (in_stack_ffffffffffffe138,
                     (Address *)CONCAT17(in_stack_ffffffffffffe137,in_stack_ffffffffffffe130),
                     in_stack_ffffffffffffe12c);
  local_f49 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe077,
                      CONCAT16(in_stack_ffffffffffffe076,
                               CONCAT15(in_stack_ffffffffffffe075,
                                        CONCAT14(in_stack_ffffffffffffe074,
                                                 CONCAT13(in_stack_ffffffffffffe073,
                                                          CONCAT12(in_stack_ffffffffffffe072,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe071,
                                                  in_stack_ffffffffffffe070))))))),
             (bool *)CONCAT17(in_stack_ffffffffffffe06f,
                              CONCAT16(in_stack_ffffffffffffe06e,
                                       CONCAT15(in_stack_ffffffffffffe06d,
                                                CONCAT14(in_stack_ffffffffffffe06c,
                                                         CONCAT13(in_stack_ffffffffffffe06b,
                                                                  CONCAT12(in_stack_ffffffffffffe06a
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffe069,
                                                  in_stack_ffffffffffffe068))))))),(type *)0x1df262)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f48);
  if (!bVar1) {
    testing::Message::Message(&local_f58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_f80,(internal *)&local_f48,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kRegtest)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_f60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x1e5,pcVar15);
    testing::internal::AssertHelper::operator=(&local_f60,&local_f58);
    testing::internal::AssertHelper::~AssertHelper(&local_f60);
    std::__cxx11::string::~string((string *)&local_f80);
    testing::Message::~Message((Message *)0x1df35a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1df3d2);
  local_f91 = cfd::AddressFactory::CheckAddressNetType
                        (in_stack_ffffffffffffe138,
                         (Address *)CONCAT17(in_stack_ffffffffffffe137,in_stack_ffffffffffffe130),
                         in_stack_ffffffffffffe12c);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe077,
                      CONCAT16(in_stack_ffffffffffffe076,
                               CONCAT15(in_stack_ffffffffffffe075,
                                        CONCAT14(in_stack_ffffffffffffe074,
                                                 CONCAT13(in_stack_ffffffffffffe073,
                                                          CONCAT12(in_stack_ffffffffffffe072,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe071,
                                                  in_stack_ffffffffffffe070))))))),
             (bool *)CONCAT17(in_stack_ffffffffffffe06f,
                              CONCAT16(in_stack_ffffffffffffe06e,
                                       CONCAT15(in_stack_ffffffffffffe06d,
                                                CONCAT14(in_stack_ffffffffffffe06c,
                                                         CONCAT13(in_stack_ffffffffffffe06b,
                                                                  CONCAT12(in_stack_ffffffffffffe06a
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffe069,
                                                  in_stack_ffffffffffffe068))))))),(type *)0x1df418)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f90);
  if (!bVar1) {
    testing::Message::Message(&local_fa0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_fc8,(internal *)&local_f90,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kLiquidV1)","false",
               "true",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_fa8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x1e6,pcVar15);
    testing::internal::AssertHelper::operator=(&local_fa8,&local_fa0);
    testing::internal::AssertHelper::~AssertHelper(&local_fa8);
    std::__cxx11::string::~string((string *)&local_fc8);
    testing::Message::~Message((Message *)0x1df510);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1df588);
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    (in_stack_ffffffffffffe138,
                     (Address *)CONCAT17(in_stack_ffffffffffffe137,in_stack_ffffffffffffe130),
                     in_stack_ffffffffffffe12c);
  local_fd9 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe077,
                      CONCAT16(in_stack_ffffffffffffe076,
                               CONCAT15(in_stack_ffffffffffffe075,
                                        CONCAT14(in_stack_ffffffffffffe074,
                                                 CONCAT13(in_stack_ffffffffffffe073,
                                                          CONCAT12(in_stack_ffffffffffffe072,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe071,
                                                  in_stack_ffffffffffffe070))))))),
             (bool *)CONCAT17(in_stack_ffffffffffffe06f,
                              CONCAT16(in_stack_ffffffffffffe06e,
                                       CONCAT15(in_stack_ffffffffffffe06d,
                                                CONCAT14(in_stack_ffffffffffffe06c,
                                                         CONCAT13(in_stack_ffffffffffffe06b,
                                                                  CONCAT12(in_stack_ffffffffffffe06a
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffe069,
                                                  in_stack_ffffffffffffe068))))))),(type *)0x1df5d0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_fd8);
  if (!bVar1) {
    testing::Message::Message(&local_fe8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1010,(internal *)&local_fd8,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kElementsRegtest)",
               "true","false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_ff0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x1e7,pcVar15);
    testing::internal::AssertHelper::operator=(&local_ff0,&local_fe8);
    testing::internal::AssertHelper::~AssertHelper(&local_ff0);
    std::__cxx11::string::~string((string *)&local_1010);
    testing::Message::~Message((Message *)0x1df6c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1df740);
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    (in_stack_ffffffffffffe138,
                     (Address *)CONCAT17(in_stack_ffffffffffffe137,in_stack_ffffffffffffe130),
                     in_stack_ffffffffffffe12c);
  local_1021 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe077,
                      CONCAT16(in_stack_ffffffffffffe076,
                               CONCAT15(in_stack_ffffffffffffe075,
                                        CONCAT14(in_stack_ffffffffffffe074,
                                                 CONCAT13(in_stack_ffffffffffffe073,
                                                          CONCAT12(in_stack_ffffffffffffe072,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe071,
                                                  in_stack_ffffffffffffe070))))))),
             (bool *)CONCAT17(in_stack_ffffffffffffe06f,
                              CONCAT16(in_stack_ffffffffffffe06e,
                                       CONCAT15(in_stack_ffffffffffffe06d,
                                                CONCAT14(in_stack_ffffffffffffe06c,
                                                         CONCAT13(in_stack_ffffffffffffe06b,
                                                                  CONCAT12(in_stack_ffffffffffffe06a
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffe069,
                                                  in_stack_ffffffffffffe068))))))),(type *)0x1df788)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1020);
  if (!bVar1) {
    testing::Message::Message(&local_1030);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1058,(internal *)&local_1020,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kCustomChain)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1038,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x1e8,pcVar15);
    testing::internal::AssertHelper::operator=(&local_1038,&local_1030);
    testing::internal::AssertHelper::~AssertHelper(&local_1038);
    std::__cxx11::string::~string((string *)&local_1058);
    testing::Message::~Message((Message *)0x1df880);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1df8f8);
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    (in_stack_ffffffffffffe138,
                     (Address *)CONCAT17(in_stack_ffffffffffffe137,in_stack_ffffffffffffe130),
                     in_stack_ffffffffffffe12c);
  local_1069 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe077,
                      CONCAT16(in_stack_ffffffffffffe076,
                               CONCAT15(in_stack_ffffffffffffe075,
                                        CONCAT14(in_stack_ffffffffffffe074,
                                                 CONCAT13(in_stack_ffffffffffffe073,
                                                          CONCAT12(in_stack_ffffffffffffe072,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe071,
                                                  in_stack_ffffffffffffe070))))))),
             (bool *)CONCAT17(in_stack_ffffffffffffe06f,
                              CONCAT16(in_stack_ffffffffffffe06e,
                                       CONCAT15(in_stack_ffffffffffffe06d,
                                                CONCAT14(in_stack_ffffffffffffe06c,
                                                         CONCAT13(in_stack_ffffffffffffe06b,
                                                                  CONCAT12(in_stack_ffffffffffffe06a
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffe069,
                                                  in_stack_ffffffffffffe068))))))),(type *)0x1df940)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1068);
  if (!bVar1) {
    testing::Message::Message(&local_1078);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_10a0,(internal *)&local_1068,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kNetTypeNum)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1080,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x1e9,pcVar15);
    testing::internal::AssertHelper::operator=(&local_1080,&local_1078);
    testing::internal::AssertHelper::~AssertHelper(&local_1080);
    std::__cxx11::string::~string((string *)&local_10a0);
    testing::Message::~Message((Message *)0x1dfa38);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1dfab3);
  cfd::core::GetElementsAddressFormatList();
  cfd::AddressFactory::AddressFactory
            ((AddressFactory *)
             CONCAT17(in_stack_ffffffffffffe077,
                      CONCAT16(in_stack_ffffffffffffe076,
                               CONCAT15(in_stack_ffffffffffffe075,
                                        CONCAT14(in_stack_ffffffffffffe074,
                                                 CONCAT13(in_stack_ffffffffffffe073,
                                                          CONCAT12(in_stack_ffffffffffffe072,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe071,
                                                  in_stack_ffffffffffffe070))))))),
             CONCAT13(in_stack_ffffffffffffe06f,
                      CONCAT12(in_stack_ffffffffffffe06e,
                               CONCAT11(in_stack_ffffffffffffe06d,in_stack_ffffffffffffe06c))),
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             0x1dfadc);
  cfd::AddressFactory::operator=
            ((AddressFactory *)
             CONCAT17(in_stack_ffffffffffffe077,
                      CONCAT16(in_stack_ffffffffffffe076,
                               CONCAT15(in_stack_ffffffffffffe075,
                                        CONCAT14(in_stack_ffffffffffffe074,
                                                 CONCAT13(in_stack_ffffffffffffe073,
                                                          CONCAT12(in_stack_ffffffffffffe072,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe071,
                                                  in_stack_ffffffffffffe070))))))),
             (AddressFactory *)
             CONCAT17(in_stack_ffffffffffffe06f,
                      CONCAT16(in_stack_ffffffffffffe06e,
                               CONCAT15(in_stack_ffffffffffffe06d,
                                        CONCAT14(in_stack_ffffffffffffe06c,
                                                 CONCAT13(in_stack_ffffffffffffe06b,
                                                          CONCAT12(in_stack_ffffffffffffe06a,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe069,
                                                  in_stack_ffffffffffffe068))))))));
  cfd::AddressFactory::~AddressFactory((AddressFactory *)0x1dfb02);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             CONCAT17(in_stack_ffffffffffffe087,
                      CONCAT16(in_stack_ffffffffffffe086,
                               CONCAT15(in_stack_ffffffffffffe085,
                                        CONCAT14(in_stack_ffffffffffffe084,
                                                 CONCAT13(in_stack_ffffffffffffe083,
                                                          CONCAT12(in_stack_ffffffffffffe082,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe081,
                                                  in_stack_ffffffffffffe080))))))));
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::CreateP2pkhAddress
                ((AddressFactory *)
                 CONCAT17(in_stack_ffffffffffffe07f,
                          CONCAT16(in_stack_ffffffffffffe07e,
                                   CONCAT15(in_stack_ffffffffffffe07d,
                                            CONCAT14(in_stack_ffffffffffffe07c,
                                                     CONCAT13(in_stack_ffffffffffffe07b,
                                                              CONCAT12(in_stack_ffffffffffffe07a,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffe079,
                                                  in_stack_ffffffffffffe078))))))),
                 (Pubkey *)
                 CONCAT17(in_stack_ffffffffffffe077,
                          CONCAT16(in_stack_ffffffffffffe076,
                                   CONCAT15(in_stack_ffffffffffffe075,
                                            CONCAT14(in_stack_ffffffffffffe074,
                                                     CONCAT13(in_stack_ffffffffffffe073,
                                                              CONCAT12(in_stack_ffffffffffffe072,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffe071,
                                                  in_stack_ffffffffffffe070))))))));
      cfd::core::Address::operator=(&local_218,&local_1260);
      cfd::core::Address::~Address
                ((Address *)
                 CONCAT17(in_stack_ffffffffffffe077,
                          CONCAT16(in_stack_ffffffffffffe076,
                                   CONCAT15(in_stack_ffffffffffffe075,
                                            CONCAT14(in_stack_ffffffffffffe074,
                                                     CONCAT13(in_stack_ffffffffffffe073,
                                                              CONCAT12(in_stack_ffffffffffffe072,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffe071,
                                                  in_stack_ffffffffffffe070))))))));
    }
  }
  else {
    testing::Message::Message(&local_1268);
    testing::internal::AssertHelper::AssertHelper
              (&local_1270,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x1ec,
               "Expected: addr = factory.CreateP2pkhAddress(pubkey) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_1270,&local_1268);
    testing::internal::AssertHelper::~AssertHelper(&local_1270);
    testing::Message::~Message((Message *)0x1dfcaa);
  }
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    (in_stack_ffffffffffffe138,
                     (Address *)CONCAT17(in_stack_ffffffffffffe137,in_stack_ffffffffffffe130),
                     in_stack_ffffffffffffe12c);
  local_1281 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe077,
                      CONCAT16(in_stack_ffffffffffffe076,
                               CONCAT15(in_stack_ffffffffffffe075,
                                        CONCAT14(in_stack_ffffffffffffe074,
                                                 CONCAT13(in_stack_ffffffffffffe073,
                                                          CONCAT12(in_stack_ffffffffffffe072,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe071,
                                                  in_stack_ffffffffffffe070))))))),
             (bool *)CONCAT17(in_stack_ffffffffffffe06f,
                              CONCAT16(in_stack_ffffffffffffe06e,
                                       CONCAT15(in_stack_ffffffffffffe06d,
                                                CONCAT14(in_stack_ffffffffffffe06c,
                                                         CONCAT13(in_stack_ffffffffffffe06b,
                                                                  CONCAT12(in_stack_ffffffffffffe06a
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffe069,
                                                  in_stack_ffffffffffffe068))))))),(type *)0x1dfd3a)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1280);
  if (!bVar1) {
    testing::Message::Message(&local_1290);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_12b8,(internal *)&local_1280,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kMainnet)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x1ed,pcVar15);
    testing::internal::AssertHelper::operator=(&local_1298,&local_1290);
    testing::internal::AssertHelper::~AssertHelper(&local_1298);
    std::__cxx11::string::~string((string *)&local_12b8);
    testing::Message::~Message((Message *)0x1dfe20);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1dfe98);
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    (in_stack_ffffffffffffe138,
                     (Address *)CONCAT17(in_stack_ffffffffffffe137,in_stack_ffffffffffffe130),
                     in_stack_ffffffffffffe12c);
  local_12c9 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe077,
                      CONCAT16(in_stack_ffffffffffffe076,
                               CONCAT15(in_stack_ffffffffffffe075,
                                        CONCAT14(in_stack_ffffffffffffe074,
                                                 CONCAT13(in_stack_ffffffffffffe073,
                                                          CONCAT12(in_stack_ffffffffffffe072,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe071,
                                                  in_stack_ffffffffffffe070))))))),
             (bool *)CONCAT17(in_stack_ffffffffffffe06f,
                              CONCAT16(in_stack_ffffffffffffe06e,
                                       CONCAT15(in_stack_ffffffffffffe06d,
                                                CONCAT14(in_stack_ffffffffffffe06c,
                                                         CONCAT13(in_stack_ffffffffffffe06b,
                                                                  CONCAT12(in_stack_ffffffffffffe06a
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffe069,
                                                  in_stack_ffffffffffffe068))))))),(type *)0x1dfee0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_12c8);
  if (!bVar1) {
    testing::Message::Message(&local_12d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1300,(internal *)&local_12c8,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kTestnet)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_12e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x1ee,pcVar15);
    testing::internal::AssertHelper::operator=(&local_12e0,&local_12d8);
    testing::internal::AssertHelper::~AssertHelper(&local_12e0);
    std::__cxx11::string::~string((string *)&local_1300);
    testing::Message::~Message((Message *)0x1dffd8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e0050);
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    (in_stack_ffffffffffffe138,
                     (Address *)CONCAT17(in_stack_ffffffffffffe137,in_stack_ffffffffffffe130),
                     in_stack_ffffffffffffe12c);
  local_1311 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe077,
                      CONCAT16(in_stack_ffffffffffffe076,
                               CONCAT15(in_stack_ffffffffffffe075,
                                        CONCAT14(in_stack_ffffffffffffe074,
                                                 CONCAT13(in_stack_ffffffffffffe073,
                                                          CONCAT12(in_stack_ffffffffffffe072,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe071,
                                                  in_stack_ffffffffffffe070))))))),
             (bool *)CONCAT17(in_stack_ffffffffffffe06f,
                              CONCAT16(in_stack_ffffffffffffe06e,
                                       CONCAT15(in_stack_ffffffffffffe06d,
                                                CONCAT14(in_stack_ffffffffffffe06c,
                                                         CONCAT13(in_stack_ffffffffffffe06b,
                                                                  CONCAT12(in_stack_ffffffffffffe06a
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffe069,
                                                  in_stack_ffffffffffffe068))))))),(type *)0x1e0098)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1310);
  if (!bVar1) {
    testing::Message::Message(&local_1320);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1348,(internal *)&local_1310,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kRegtest)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1328,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x1ef,pcVar15);
    testing::internal::AssertHelper::operator=(&local_1328,&local_1320);
    testing::internal::AssertHelper::~AssertHelper(&local_1328);
    std::__cxx11::string::~string((string *)&local_1348);
    testing::Message::~Message((Message *)0x1e0190);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e0208);
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    (in_stack_ffffffffffffe138,
                     (Address *)CONCAT17(in_stack_ffffffffffffe137,in_stack_ffffffffffffe130),
                     in_stack_ffffffffffffe12c);
  local_1359 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe077,
                      CONCAT16(in_stack_ffffffffffffe076,
                               CONCAT15(in_stack_ffffffffffffe075,
                                        CONCAT14(in_stack_ffffffffffffe074,
                                                 CONCAT13(in_stack_ffffffffffffe073,
                                                          CONCAT12(in_stack_ffffffffffffe072,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe071,
                                                  in_stack_ffffffffffffe070))))))),
             (bool *)CONCAT17(in_stack_ffffffffffffe06f,
                              CONCAT16(in_stack_ffffffffffffe06e,
                                       CONCAT15(in_stack_ffffffffffffe06d,
                                                CONCAT14(in_stack_ffffffffffffe06c,
                                                         CONCAT13(in_stack_ffffffffffffe06b,
                                                                  CONCAT12(in_stack_ffffffffffffe06a
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffe069,
                                                  in_stack_ffffffffffffe068))))))),(type *)0x1e0250)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1358);
  if (!bVar1) {
    testing::Message::Message(&local_1368);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1390,(internal *)&local_1358,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kLiquidV1)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1370,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x1f0,pcVar15);
    testing::internal::AssertHelper::operator=(&local_1370,&local_1368);
    testing::internal::AssertHelper::~AssertHelper(&local_1370);
    std::__cxx11::string::~string((string *)&local_1390);
    testing::Message::~Message((Message *)0x1e0348);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e03c0);
  local_13a1 = cfd::AddressFactory::CheckAddressNetType
                         (in_stack_ffffffffffffe138,
                          (Address *)CONCAT17(in_stack_ffffffffffffe137,in_stack_ffffffffffffe130),
                          in_stack_ffffffffffffe12c);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe077,
                      CONCAT16(in_stack_ffffffffffffe076,
                               CONCAT15(in_stack_ffffffffffffe075,
                                        CONCAT14(in_stack_ffffffffffffe074,
                                                 CONCAT13(in_stack_ffffffffffffe073,
                                                          CONCAT12(in_stack_ffffffffffffe072,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe071,
                                                  in_stack_ffffffffffffe070))))))),
             (bool *)CONCAT17(in_stack_ffffffffffffe06f,
                              CONCAT16(in_stack_ffffffffffffe06e,
                                       CONCAT15(in_stack_ffffffffffffe06d,
                                                CONCAT14(in_stack_ffffffffffffe06c,
                                                         CONCAT13(in_stack_ffffffffffffe06b,
                                                                  CONCAT12(in_stack_ffffffffffffe06a
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffe069,
                                                  in_stack_ffffffffffffe068))))))),(type *)0x1e0406)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_13a0);
  if (!bVar1) {
    testing::Message::Message(&local_13b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_13d8,(internal *)&local_13a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kElementsRegtest)",
               "false","true",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_13b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x1f1,pcVar15);
    testing::internal::AssertHelper::operator=(&local_13b8,&local_13b0);
    testing::internal::AssertHelper::~AssertHelper(&local_13b8);
    std::__cxx11::string::~string((string *)&local_13d8);
    testing::Message::~Message((Message *)0x1e04fe);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e0576);
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    (in_stack_ffffffffffffe138,
                     (Address *)CONCAT17(in_stack_ffffffffffffe137,in_stack_ffffffffffffe130),
                     in_stack_ffffffffffffe12c);
  local_13e9 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe077,
                      CONCAT16(in_stack_ffffffffffffe076,
                               CONCAT15(in_stack_ffffffffffffe075,
                                        CONCAT14(in_stack_ffffffffffffe074,
                                                 CONCAT13(in_stack_ffffffffffffe073,
                                                          CONCAT12(in_stack_ffffffffffffe072,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe071,
                                                  in_stack_ffffffffffffe070))))))),
             (bool *)CONCAT17(in_stack_ffffffffffffe06f,
                              CONCAT16(in_stack_ffffffffffffe06e,
                                       CONCAT15(in_stack_ffffffffffffe06d,
                                                CONCAT14(in_stack_ffffffffffffe06c,
                                                         CONCAT13(in_stack_ffffffffffffe06b,
                                                                  CONCAT12(in_stack_ffffffffffffe06a
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffe069,
                                                  in_stack_ffffffffffffe068))))))),(type *)0x1e05be)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_13e8);
  if (!bVar1) {
    testing::Message::Message(&local_13f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1420,(internal *)&local_13e8,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kCustomChain)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1400,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x1f2,pcVar15);
    testing::internal::AssertHelper::operator=(&local_1400,&local_13f8);
    testing::internal::AssertHelper::~AssertHelper(&local_1400);
    std::__cxx11::string::~string((string *)&local_1420);
    testing::Message::~Message((Message *)0x1e06b6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e072e);
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    (in_stack_ffffffffffffe138,
                     (Address *)CONCAT17(in_stack_ffffffffffffe137,in_stack_ffffffffffffe130),
                     in_stack_ffffffffffffe12c);
  local_1431 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe077,
                      CONCAT16(in_stack_ffffffffffffe076,
                               CONCAT15(in_stack_ffffffffffffe075,
                                        CONCAT14(in_stack_ffffffffffffe074,
                                                 CONCAT13(in_stack_ffffffffffffe073,
                                                          CONCAT12(in_stack_ffffffffffffe072,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe071,
                                                  in_stack_ffffffffffffe070))))))),
             (bool *)CONCAT17(in_stack_ffffffffffffe06f,
                              CONCAT16(in_stack_ffffffffffffe06e,
                                       CONCAT15(in_stack_ffffffffffffe06d,
                                                CONCAT14(in_stack_ffffffffffffe06c,
                                                         CONCAT13(in_stack_ffffffffffffe06b,
                                                                  CONCAT12(in_stack_ffffffffffffe06a
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffe069,
                                                  in_stack_ffffffffffffe068))))))),(type *)0x1e0776)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1430);
  if (!bVar1) {
    testing::Message::Message(&local_1440);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1468,(internal *)&local_1430,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kNetTypeNum)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1448,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,499,pcVar15);
    testing::internal::AssertHelper::operator=(&local_1448,&local_1440);
    testing::internal::AssertHelper::~AssertHelper(&local_1448);
    std::__cxx11::string::~string((string *)&local_1468);
    testing::Message::~Message((Message *)0x1e086e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e08e9);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::CreateP2wpkhAddress
                ((AddressFactory *)
                 CONCAT17(in_stack_ffffffffffffe07f,
                          CONCAT16(in_stack_ffffffffffffe07e,
                                   CONCAT15(in_stack_ffffffffffffe07d,
                                            CONCAT14(in_stack_ffffffffffffe07c,
                                                     CONCAT13(in_stack_ffffffffffffe07b,
                                                              CONCAT12(in_stack_ffffffffffffe07a,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffe079,
                                                  in_stack_ffffffffffffe078))))))),
                 (Pubkey *)
                 CONCAT17(in_stack_ffffffffffffe077,
                          CONCAT16(in_stack_ffffffffffffe076,
                                   CONCAT15(in_stack_ffffffffffffe075,
                                            CONCAT14(in_stack_ffffffffffffe074,
                                                     CONCAT13(in_stack_ffffffffffffe073,
                                                              CONCAT12(in_stack_ffffffffffffe072,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffe071,
                                                  in_stack_ffffffffffffe070))))))));
      cfd::core::Address::operator=(&local_218,&local_15e8);
      cfd::core::Address::~Address
                ((Address *)
                 CONCAT17(in_stack_ffffffffffffe077,
                          CONCAT16(in_stack_ffffffffffffe076,
                                   CONCAT15(in_stack_ffffffffffffe075,
                                            CONCAT14(in_stack_ffffffffffffe074,
                                                     CONCAT13(in_stack_ffffffffffffe073,
                                                              CONCAT12(in_stack_ffffffffffffe072,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffe071,
                                                  in_stack_ffffffffffffe070))))))));
    }
  }
  else {
    testing::Message::Message(&local_15f0);
    testing::internal::AssertHelper::AssertHelper
              (&local_15f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x1f5,
               "Expected: addr = factory.CreateP2wpkhAddress(pubkey) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_15f8,&local_15f0);
    testing::internal::AssertHelper::~AssertHelper(&local_15f8);
    testing::Message::~Message((Message *)0x1e0a38);
  }
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    (in_stack_ffffffffffffe138,
                     (Address *)CONCAT17(in_stack_ffffffffffffe137,in_stack_ffffffffffffe130),
                     in_stack_ffffffffffffe12c);
  local_1609 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe077,
                      CONCAT16(in_stack_ffffffffffffe076,
                               CONCAT15(in_stack_ffffffffffffe075,
                                        CONCAT14(in_stack_ffffffffffffe074,
                                                 CONCAT13(in_stack_ffffffffffffe073,
                                                          CONCAT12(in_stack_ffffffffffffe072,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe071,
                                                  in_stack_ffffffffffffe070))))))),
             (bool *)CONCAT17(in_stack_ffffffffffffe06f,
                              CONCAT16(in_stack_ffffffffffffe06e,
                                       CONCAT15(in_stack_ffffffffffffe06d,
                                                CONCAT14(in_stack_ffffffffffffe06c,
                                                         CONCAT13(in_stack_ffffffffffffe06b,
                                                                  CONCAT12(in_stack_ffffffffffffe06a
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffe069,
                                                  in_stack_ffffffffffffe068))))))),(type *)0x1e0ac8)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1608);
  if (!bVar1) {
    testing::Message::Message(&local_1618);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1640,(internal *)&local_1608,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kMainnet)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1620,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x1f6,pcVar15);
    testing::internal::AssertHelper::operator=(&local_1620,&local_1618);
    testing::internal::AssertHelper::~AssertHelper(&local_1620);
    std::__cxx11::string::~string((string *)&local_1640);
    testing::Message::~Message((Message *)0x1e0bae);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e0c26);
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    (in_stack_ffffffffffffe138,
                     (Address *)CONCAT17(in_stack_ffffffffffffe137,in_stack_ffffffffffffe130),
                     in_stack_ffffffffffffe12c);
  local_1651 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe077,
                      CONCAT16(in_stack_ffffffffffffe076,
                               CONCAT15(in_stack_ffffffffffffe075,
                                        CONCAT14(in_stack_ffffffffffffe074,
                                                 CONCAT13(in_stack_ffffffffffffe073,
                                                          CONCAT12(in_stack_ffffffffffffe072,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe071,
                                                  in_stack_ffffffffffffe070))))))),
             (bool *)CONCAT17(in_stack_ffffffffffffe06f,
                              CONCAT16(in_stack_ffffffffffffe06e,
                                       CONCAT15(in_stack_ffffffffffffe06d,
                                                CONCAT14(in_stack_ffffffffffffe06c,
                                                         CONCAT13(in_stack_ffffffffffffe06b,
                                                                  CONCAT12(in_stack_ffffffffffffe06a
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffe069,
                                                  in_stack_ffffffffffffe068))))))),(type *)0x1e0c6e)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1650);
  if (!bVar1) {
    testing::Message::Message(&local_1660);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1688,(internal *)&local_1650,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kTestnet)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1668,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x1f7,pcVar15);
    testing::internal::AssertHelper::operator=(&local_1668,&local_1660);
    testing::internal::AssertHelper::~AssertHelper(&local_1668);
    std::__cxx11::string::~string((string *)&local_1688);
    testing::Message::~Message((Message *)0x1e0d66);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e0dde);
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    (in_stack_ffffffffffffe138,
                     (Address *)CONCAT17(in_stack_ffffffffffffe137,in_stack_ffffffffffffe130),
                     in_stack_ffffffffffffe12c);
  local_1699 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe077,
                      CONCAT16(in_stack_ffffffffffffe076,
                               CONCAT15(in_stack_ffffffffffffe075,
                                        CONCAT14(in_stack_ffffffffffffe074,
                                                 CONCAT13(in_stack_ffffffffffffe073,
                                                          CONCAT12(in_stack_ffffffffffffe072,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe071,
                                                  in_stack_ffffffffffffe070))))))),
             (bool *)CONCAT17(in_stack_ffffffffffffe06f,
                              CONCAT16(in_stack_ffffffffffffe06e,
                                       CONCAT15(in_stack_ffffffffffffe06d,
                                                CONCAT14(in_stack_ffffffffffffe06c,
                                                         CONCAT13(in_stack_ffffffffffffe06b,
                                                                  CONCAT12(in_stack_ffffffffffffe06a
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffe069,
                                                  in_stack_ffffffffffffe068))))))),(type *)0x1e0e26)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1698);
  if (!bVar1) {
    testing::Message::Message(&local_16a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_16d0,(internal *)&local_1698,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kRegtest)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_16b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x1f8,pcVar15);
    testing::internal::AssertHelper::operator=(&local_16b0,&local_16a8);
    testing::internal::AssertHelper::~AssertHelper(&local_16b0);
    std::__cxx11::string::~string((string *)&local_16d0);
    testing::Message::~Message((Message *)0x1e0f1e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e0f96);
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    (in_stack_ffffffffffffe138,
                     (Address *)CONCAT17(in_stack_ffffffffffffe137,in_stack_ffffffffffffe130),
                     in_stack_ffffffffffffe12c);
  local_16e1 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe077,
                      CONCAT16(in_stack_ffffffffffffe076,
                               CONCAT15(in_stack_ffffffffffffe075,
                                        CONCAT14(in_stack_ffffffffffffe074,
                                                 CONCAT13(in_stack_ffffffffffffe073,
                                                          CONCAT12(in_stack_ffffffffffffe072,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe071,
                                                  in_stack_ffffffffffffe070))))))),
             (bool *)CONCAT17(in_stack_ffffffffffffe06f,
                              CONCAT16(in_stack_ffffffffffffe06e,
                                       CONCAT15(in_stack_ffffffffffffe06d,
                                                CONCAT14(in_stack_ffffffffffffe06c,
                                                         CONCAT13(in_stack_ffffffffffffe06b,
                                                                  CONCAT12(in_stack_ffffffffffffe06a
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffe069,
                                                  in_stack_ffffffffffffe068))))))),(type *)0x1e0fde)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_16e0);
  if (!bVar1) {
    testing::Message::Message(&local_16f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1718,(internal *)&local_16e0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kLiquidV1)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_16f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x1f9,pcVar15);
    testing::internal::AssertHelper::operator=(&local_16f8,&local_16f0);
    testing::internal::AssertHelper::~AssertHelper(&local_16f8);
    std::__cxx11::string::~string((string *)&local_1718);
    testing::Message::~Message((Message *)0x1e10d6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e114e);
  local_1729 = cfd::AddressFactory::CheckAddressNetType
                         (in_stack_ffffffffffffe138,
                          (Address *)CONCAT17(in_stack_ffffffffffffe137,in_stack_ffffffffffffe130),
                          in_stack_ffffffffffffe12c);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe077,
                      CONCAT16(in_stack_ffffffffffffe076,
                               CONCAT15(in_stack_ffffffffffffe075,
                                        CONCAT14(in_stack_ffffffffffffe074,
                                                 CONCAT13(in_stack_ffffffffffffe073,
                                                          CONCAT12(in_stack_ffffffffffffe072,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe071,
                                                  in_stack_ffffffffffffe070))))))),
             (bool *)CONCAT17(in_stack_ffffffffffffe06f,
                              CONCAT16(in_stack_ffffffffffffe06e,
                                       CONCAT15(in_stack_ffffffffffffe06d,
                                                CONCAT14(in_stack_ffffffffffffe06c,
                                                         CONCAT13(in_stack_ffffffffffffe06b,
                                                                  CONCAT12(in_stack_ffffffffffffe06a
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffe069,
                                                  in_stack_ffffffffffffe068))))))),(type *)0x1e1194)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1728);
  if (!bVar1) {
    testing::Message::Message(&local_1738);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1760,(internal *)&local_1728,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kElementsRegtest)",
               "false","true",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1740,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x1fa,pcVar15);
    testing::internal::AssertHelper::operator=(&local_1740,&local_1738);
    testing::internal::AssertHelper::~AssertHelper(&local_1740);
    std::__cxx11::string::~string((string *)&local_1760);
    testing::Message::~Message((Message *)0x1e128c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e1304);
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    (in_stack_ffffffffffffe138,
                     (Address *)CONCAT17(in_stack_ffffffffffffe137,in_stack_ffffffffffffe130),
                     in_stack_ffffffffffffe12c);
  local_1771 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe077,
                      CONCAT16(in_stack_ffffffffffffe076,
                               CONCAT15(in_stack_ffffffffffffe075,
                                        CONCAT14(in_stack_ffffffffffffe074,
                                                 CONCAT13(in_stack_ffffffffffffe073,
                                                          CONCAT12(in_stack_ffffffffffffe072,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe071,
                                                  in_stack_ffffffffffffe070))))))),
             (bool *)CONCAT17(in_stack_ffffffffffffe06f,
                              CONCAT16(in_stack_ffffffffffffe06e,
                                       CONCAT15(in_stack_ffffffffffffe06d,
                                                CONCAT14(in_stack_ffffffffffffe06c,
                                                         CONCAT13(in_stack_ffffffffffffe06b,
                                                                  CONCAT12(in_stack_ffffffffffffe06a
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffe069,
                                                  in_stack_ffffffffffffe068))))))),(type *)0x1e134c)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1770);
  if (!bVar1) {
    testing::Message::Message(&local_1780);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_17a8,(internal *)&local_1770,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kCustomChain)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1788,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x1fb,pcVar15);
    testing::internal::AssertHelper::operator=(&local_1788,&local_1780);
    testing::internal::AssertHelper::~AssertHelper(&local_1788);
    std::__cxx11::string::~string((string *)&local_17a8);
    testing::Message::~Message((Message *)0x1e1444);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e14bc);
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    (in_stack_ffffffffffffe138,
                     (Address *)CONCAT17(in_stack_ffffffffffffe137,in_stack_ffffffffffffe130),
                     in_stack_ffffffffffffe12c);
  local_17b9 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe077,
                      CONCAT16(in_stack_ffffffffffffe076,
                               CONCAT15(in_stack_ffffffffffffe075,
                                        CONCAT14(in_stack_ffffffffffffe074,
                                                 CONCAT13(in_stack_ffffffffffffe073,
                                                          CONCAT12(in_stack_ffffffffffffe072,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe071,
                                                  in_stack_ffffffffffffe070))))))),
             (bool *)CONCAT17(in_stack_ffffffffffffe06f,
                              CONCAT16(in_stack_ffffffffffffe06e,
                                       CONCAT15(in_stack_ffffffffffffe06d,
                                                CONCAT14(in_stack_ffffffffffffe06c,
                                                         CONCAT13(in_stack_ffffffffffffe06b,
                                                                  CONCAT12(in_stack_ffffffffffffe06a
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffe069,
                                                  in_stack_ffffffffffffe068))))))),(type *)0x1e1504)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_17b8);
  if (!bVar1) {
    testing::Message::Message(&local_17c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_17f0,(internal *)&local_17b8,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kNetTypeNum)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_17d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x1fc,pcVar15);
    testing::internal::AssertHelper::operator=(&local_17d0,&local_17c8);
    testing::internal::AssertHelper::~AssertHelper(&local_17d0);
    std::__cxx11::string::~string((string *)&local_17f0);
    testing::Message::~Message((Message *)0x1e15fc);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e1677);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::CreateP2shAddress
                ((AddressFactory *)
                 CONCAT17(in_stack_ffffffffffffe07f,
                          CONCAT16(in_stack_ffffffffffffe07e,
                                   CONCAT15(in_stack_ffffffffffffe07d,
                                            CONCAT14(in_stack_ffffffffffffe07c,
                                                     CONCAT13(in_stack_ffffffffffffe07b,
                                                              CONCAT12(in_stack_ffffffffffffe07a,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffe079,
                                                  in_stack_ffffffffffffe078))))))),
                 (Script *)
                 CONCAT17(in_stack_ffffffffffffe077,
                          CONCAT16(in_stack_ffffffffffffe076,
                                   CONCAT15(in_stack_ffffffffffffe075,
                                            CONCAT14(in_stack_ffffffffffffe074,
                                                     CONCAT13(in_stack_ffffffffffffe073,
                                                              CONCAT12(in_stack_ffffffffffffe072,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffe071,
                                                  in_stack_ffffffffffffe070))))))));
      cfd::core::Address::operator=(&local_218,&local_1970);
      cfd::core::Address::~Address
                ((Address *)
                 CONCAT17(in_stack_ffffffffffffe077,
                          CONCAT16(in_stack_ffffffffffffe076,
                                   CONCAT15(in_stack_ffffffffffffe075,
                                            CONCAT14(in_stack_ffffffffffffe074,
                                                     CONCAT13(in_stack_ffffffffffffe073,
                                                              CONCAT12(in_stack_ffffffffffffe072,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffe071,
                                                  in_stack_ffffffffffffe070))))))));
    }
  }
  else {
    testing::Message::Message(&local_1978);
    testing::internal::AssertHelper::AssertHelper
              (&local_1980,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x1fe,
               "Expected: addr = factory.CreateP2shAddress(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_1980,&local_1978);
    testing::internal::AssertHelper::~AssertHelper(&local_1980);
    testing::Message::~Message((Message *)0x1e17c6);
  }
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    (in_stack_ffffffffffffe138,
                     (Address *)CONCAT17(in_stack_ffffffffffffe137,in_stack_ffffffffffffe130),
                     in_stack_ffffffffffffe12c);
  local_1991 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe077,
                      CONCAT16(in_stack_ffffffffffffe076,
                               CONCAT15(in_stack_ffffffffffffe075,
                                        CONCAT14(in_stack_ffffffffffffe074,
                                                 CONCAT13(in_stack_ffffffffffffe073,
                                                          CONCAT12(in_stack_ffffffffffffe072,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe071,
                                                  in_stack_ffffffffffffe070))))))),
             (bool *)CONCAT17(in_stack_ffffffffffffe06f,
                              CONCAT16(in_stack_ffffffffffffe06e,
                                       CONCAT15(in_stack_ffffffffffffe06d,
                                                CONCAT14(in_stack_ffffffffffffe06c,
                                                         CONCAT13(in_stack_ffffffffffffe06b,
                                                                  CONCAT12(in_stack_ffffffffffffe06a
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffe069,
                                                  in_stack_ffffffffffffe068))))))),(type *)0x1e1856)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1990);
  if (!bVar1) {
    testing::Message::Message(&local_19a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_19c8,(internal *)&local_1990,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kMainnet)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_19a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x1ff,pcVar15);
    testing::internal::AssertHelper::operator=(&local_19a8,&local_19a0);
    testing::internal::AssertHelper::~AssertHelper(&local_19a8);
    std::__cxx11::string::~string((string *)&local_19c8);
    testing::Message::~Message((Message *)0x1e193c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e19b4);
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    (in_stack_ffffffffffffe138,
                     (Address *)CONCAT17(in_stack_ffffffffffffe137,in_stack_ffffffffffffe130),
                     in_stack_ffffffffffffe12c);
  local_19d9 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe077,
                      CONCAT16(in_stack_ffffffffffffe076,
                               CONCAT15(in_stack_ffffffffffffe075,
                                        CONCAT14(in_stack_ffffffffffffe074,
                                                 CONCAT13(in_stack_ffffffffffffe073,
                                                          CONCAT12(in_stack_ffffffffffffe072,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe071,
                                                  in_stack_ffffffffffffe070))))))),
             (bool *)CONCAT17(in_stack_ffffffffffffe06f,
                              CONCAT16(in_stack_ffffffffffffe06e,
                                       CONCAT15(in_stack_ffffffffffffe06d,
                                                CONCAT14(in_stack_ffffffffffffe06c,
                                                         CONCAT13(in_stack_ffffffffffffe06b,
                                                                  CONCAT12(in_stack_ffffffffffffe06a
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffe069,
                                                  in_stack_ffffffffffffe068))))))),(type *)0x1e19fc)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_19d8);
  if (!bVar1) {
    testing::Message::Message(&local_19e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1a10,(internal *)&local_19d8,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kTestnet)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_19f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x200,pcVar15);
    testing::internal::AssertHelper::operator=(&local_19f0,&local_19e8);
    testing::internal::AssertHelper::~AssertHelper(&local_19f0);
    std::__cxx11::string::~string((string *)&local_1a10);
    testing::Message::~Message((Message *)0x1e1af4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e1b6c);
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    (in_stack_ffffffffffffe138,
                     (Address *)CONCAT17(in_stack_ffffffffffffe137,in_stack_ffffffffffffe130),
                     in_stack_ffffffffffffe12c);
  local_1a21 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe077,
                      CONCAT16(in_stack_ffffffffffffe076,
                               CONCAT15(in_stack_ffffffffffffe075,
                                        CONCAT14(in_stack_ffffffffffffe074,
                                                 CONCAT13(in_stack_ffffffffffffe073,
                                                          CONCAT12(in_stack_ffffffffffffe072,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe071,
                                                  in_stack_ffffffffffffe070))))))),
             (bool *)CONCAT17(in_stack_ffffffffffffe06f,
                              CONCAT16(in_stack_ffffffffffffe06e,
                                       CONCAT15(in_stack_ffffffffffffe06d,
                                                CONCAT14(in_stack_ffffffffffffe06c,
                                                         CONCAT13(in_stack_ffffffffffffe06b,
                                                                  CONCAT12(in_stack_ffffffffffffe06a
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffe069,
                                                  in_stack_ffffffffffffe068))))))),(type *)0x1e1bb4)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1a20);
  if (!bVar1) {
    testing::Message::Message(&local_1a30);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1a58,(internal *)&local_1a20,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kRegtest)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1a38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x201,pcVar15);
    testing::internal::AssertHelper::operator=(&local_1a38,&local_1a30);
    testing::internal::AssertHelper::~AssertHelper(&local_1a38);
    std::__cxx11::string::~string((string *)&local_1a58);
    testing::Message::~Message((Message *)0x1e1cac);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e1d24);
  uVar2 = cfd::AddressFactory::CheckAddressNetType
                    (in_stack_ffffffffffffe138,
                     (Address *)CONCAT17(in_stack_ffffffffffffe137,in_stack_ffffffffffffe130),
                     in_stack_ffffffffffffe12c);
  local_1a69 = ~uVar2 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe077,
                      CONCAT16(in_stack_ffffffffffffe076,
                               CONCAT15(in_stack_ffffffffffffe075,
                                        CONCAT14(in_stack_ffffffffffffe074,
                                                 CONCAT13(in_stack_ffffffffffffe073,
                                                          CONCAT12(in_stack_ffffffffffffe072,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe071,
                                                  in_stack_ffffffffffffe070))))))),
             (bool *)CONCAT17(in_stack_ffffffffffffe06f,
                              CONCAT16(in_stack_ffffffffffffe06e,
                                       CONCAT15(in_stack_ffffffffffffe06d,
                                                CONCAT14(in_stack_ffffffffffffe06c,
                                                         CONCAT13(in_stack_ffffffffffffe06b,
                                                                  CONCAT12(in_stack_ffffffffffffe06a
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffe069,
                                                  in_stack_ffffffffffffe068))))))),(type *)0x1e1d6c)
  ;
  uVar3 = testing::AssertionResult::operator_cast_to_bool(&local_1a68);
  if (!(bool)uVar3) {
    testing::Message::Message(&local_1a78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1aa0,(internal *)&local_1a68,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kLiquidV1)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1a80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x202,pcVar15);
    testing::internal::AssertHelper::operator=(&local_1a80,&local_1a78);
    testing::internal::AssertHelper::~AssertHelper(&local_1a80);
    std::__cxx11::string::~string((string *)&local_1aa0);
    testing::Message::~Message((Message *)0x1e1e64);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e1edc);
  uVar4 = cfd::AddressFactory::CheckAddressNetType
                    (in_stack_ffffffffffffe138,
                     (Address *)CONCAT17(in_stack_ffffffffffffe137,in_stack_ffffffffffffe130),
                     in_stack_ffffffffffffe12c);
  local_1ab1 = uVar4;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe077,
                      CONCAT16(in_stack_ffffffffffffe076,
                               CONCAT15(in_stack_ffffffffffffe075,
                                        CONCAT14(in_stack_ffffffffffffe074,
                                                 CONCAT13(in_stack_ffffffffffffe073,
                                                          CONCAT12(in_stack_ffffffffffffe072,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe071,
                                                  in_stack_ffffffffffffe070))))))),
             (bool *)CONCAT17(in_stack_ffffffffffffe06f,
                              CONCAT16(in_stack_ffffffffffffe06e,
                                       CONCAT15(in_stack_ffffffffffffe06d,
                                                CONCAT14(in_stack_ffffffffffffe06c,
                                                         CONCAT13(in_stack_ffffffffffffe06b,
                                                                  CONCAT12(in_stack_ffffffffffffe06a
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffe069,
                                                  in_stack_ffffffffffffe068))))))),(type *)0x1e1f22)
  ;
  uVar5 = testing::AssertionResult::operator_cast_to_bool(&local_1ab0);
  if (!(bool)uVar5) {
    testing::Message::Message(&local_1ac0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1ae8,(internal *)&local_1ab0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kElementsRegtest)",
               "false","true",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1ac8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x203,pcVar15);
    testing::internal::AssertHelper::operator=(&local_1ac8,&local_1ac0);
    testing::internal::AssertHelper::~AssertHelper(&local_1ac8);
    std::__cxx11::string::~string((string *)&local_1ae8);
    testing::Message::~Message((Message *)0x1e201a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e2092);
  uVar6 = cfd::AddressFactory::CheckAddressNetType
                    (in_stack_ffffffffffffe138,
                     (Address *)CONCAT17(in_stack_ffffffffffffe137,in_stack_ffffffffffffe130),
                     in_stack_ffffffffffffe12c);
  local_1af9 = ~uVar6 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe077,
                      CONCAT16(in_stack_ffffffffffffe076,
                               CONCAT15(in_stack_ffffffffffffe075,
                                        CONCAT14(in_stack_ffffffffffffe074,
                                                 CONCAT13(in_stack_ffffffffffffe073,
                                                          CONCAT12(in_stack_ffffffffffffe072,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe071,
                                                  in_stack_ffffffffffffe070))))))),
             (bool *)CONCAT17(in_stack_ffffffffffffe06f,
                              CONCAT16(in_stack_ffffffffffffe06e,
                                       CONCAT15(in_stack_ffffffffffffe06d,
                                                CONCAT14(in_stack_ffffffffffffe06c,
                                                         CONCAT13(in_stack_ffffffffffffe06b,
                                                                  CONCAT12(in_stack_ffffffffffffe06a
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffe069,
                                                  in_stack_ffffffffffffe068))))))),(type *)0x1e20da)
  ;
  uVar7 = testing::AssertionResult::operator_cast_to_bool(&local_1af8);
  if (!(bool)uVar7) {
    testing::Message::Message(&local_1b08);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1b30,(internal *)&local_1af8,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kCustomChain)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1b10,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x204,pcVar15);
    testing::internal::AssertHelper::operator=(&local_1b10,&local_1b08);
    testing::internal::AssertHelper::~AssertHelper(&local_1b10);
    std::__cxx11::string::~string((string *)&local_1b30);
    testing::Message::~Message((Message *)0x1e21d2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e224a);
  uVar8 = cfd::AddressFactory::CheckAddressNetType
                    (in_stack_ffffffffffffe138,
                     (Address *)CONCAT17(in_stack_ffffffffffffe137,in_stack_ffffffffffffe130),
                     in_stack_ffffffffffffe12c);
  local_1b41 = ~uVar8 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe077,
                      CONCAT16(in_stack_ffffffffffffe076,
                               CONCAT15(in_stack_ffffffffffffe075,
                                        CONCAT14(in_stack_ffffffffffffe074,
                                                 CONCAT13(in_stack_ffffffffffffe073,
                                                          CONCAT12(in_stack_ffffffffffffe072,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe071,
                                                  in_stack_ffffffffffffe070))))))),
             (bool *)CONCAT17(in_stack_ffffffffffffe06f,
                              CONCAT16(in_stack_ffffffffffffe06e,
                                       CONCAT15(in_stack_ffffffffffffe06d,
                                                CONCAT14(in_stack_ffffffffffffe06c,
                                                         CONCAT13(in_stack_ffffffffffffe06b,
                                                                  CONCAT12(in_stack_ffffffffffffe06a
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffe069,
                                                  in_stack_ffffffffffffe068))))))),(type *)0x1e2292)
  ;
  uVar9 = testing::AssertionResult::operator_cast_to_bool(&local_1b40);
  if (!(bool)uVar9) {
    testing::Message::Message(&local_1b50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1b78,(internal *)&local_1b40,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kNetTypeNum)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1b58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x205,pcVar15);
    testing::internal::AssertHelper::operator=(&local_1b58,&local_1b50);
    testing::internal::AssertHelper::~AssertHelper(&local_1b58);
    std::__cxx11::string::~string((string *)&local_1b78);
    testing::Message::~Message((Message *)0x1e238a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e2405);
  uVar10 = testing::internal::AlwaysTrue();
  if ((bool)uVar10) {
    in_stack_ffffffffffffe076 = testing::internal::AlwaysTrue();
    if ((bool)in_stack_ffffffffffffe076) {
      cfd::AddressFactory::CreateP2wshAddress
                ((AddressFactory *)
                 CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(uVar6,CONCAT12
                                                  (uVar7,CONCAT11(uVar8,uVar9))))))),
                 (Script *)
                 CONCAT17(uVar10,CONCAT16(in_stack_ffffffffffffe076,
                                          CONCAT15(in_stack_ffffffffffffe075,
                                                   CONCAT14(in_stack_ffffffffffffe074,
                                                            CONCAT13(in_stack_ffffffffffffe073,
                                                                     CONCAT12(
                                                  in_stack_ffffffffffffe072,
                                                  CONCAT11(in_stack_ffffffffffffe071,
                                                           in_stack_ffffffffffffe070))))))));
      cfd::core::Address::operator=(&local_218,&local_1cf8);
      cfd::core::Address::~Address
                ((Address *)
                 CONCAT17(uVar10,CONCAT16(in_stack_ffffffffffffe076,
                                          CONCAT15(in_stack_ffffffffffffe075,
                                                   CONCAT14(in_stack_ffffffffffffe074,
                                                            CONCAT13(in_stack_ffffffffffffe073,
                                                                     CONCAT12(
                                                  in_stack_ffffffffffffe072,
                                                  CONCAT11(in_stack_ffffffffffffe071,
                                                           in_stack_ffffffffffffe070))))))));
    }
  }
  else {
    testing::Message::Message(&local_1d00);
    testing::internal::AssertHelper::AssertHelper
              (&local_1d08,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x207,
               "Expected: addr = factory.CreateP2wshAddress(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_1d08,&local_1d00);
    testing::internal::AssertHelper::~AssertHelper(&local_1d08);
    testing::Message::~Message((Message *)0x1e2554);
  }
  uVar2 = cfd::AddressFactory::CheckAddressNetType
                    (in_stack_ffffffffffffe138,
                     (Address *)CONCAT17(in_stack_ffffffffffffe137,in_stack_ffffffffffffe130),
                     in_stack_ffffffffffffe12c);
  local_1d19 = ~uVar2 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(uVar10,CONCAT16(in_stack_ffffffffffffe076,
                                      CONCAT15(uVar2,CONCAT14(in_stack_ffffffffffffe074,
                                                              CONCAT13(in_stack_ffffffffffffe073,
                                                                       CONCAT12(
                                                  in_stack_ffffffffffffe072,
                                                  CONCAT11(in_stack_ffffffffffffe071,
                                                           in_stack_ffffffffffffe070))))))),
             (bool *)CONCAT17(in_stack_ffffffffffffe06f,
                              CONCAT16(in_stack_ffffffffffffe06e,
                                       CONCAT15(in_stack_ffffffffffffe06d,
                                                CONCAT14(in_stack_ffffffffffffe06c,
                                                         CONCAT13(in_stack_ffffffffffffe06b,
                                                                  CONCAT12(in_stack_ffffffffffffe06a
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffe069,
                                                  in_stack_ffffffffffffe068))))))),(type *)0x1e25e4)
  ;
  uVar3 = testing::AssertionResult::operator_cast_to_bool(&local_1d18);
  if (!(bool)uVar3) {
    testing::Message::Message(&local_1d28);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1d50,(internal *)&local_1d18,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kMainnet)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1d30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x208,pcVar15);
    testing::internal::AssertHelper::operator=(&local_1d30,&local_1d28);
    testing::internal::AssertHelper::~AssertHelper(&local_1d30);
    std::__cxx11::string::~string((string *)&local_1d50);
    testing::Message::~Message((Message *)0x1e26ca);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e2742);
  uVar4 = cfd::AddressFactory::CheckAddressNetType
                    (in_stack_ffffffffffffe138,
                     (Address *)CONCAT17(in_stack_ffffffffffffe137,in_stack_ffffffffffffe130),
                     in_stack_ffffffffffffe12c);
  local_1d61 = ~uVar4 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(uVar10,CONCAT16(in_stack_ffffffffffffe076,
                                      CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(uVar4,CONCAT12(
                                                  in_stack_ffffffffffffe072,
                                                  CONCAT11(in_stack_ffffffffffffe071,
                                                           in_stack_ffffffffffffe070))))))),
             (bool *)CONCAT17(in_stack_ffffffffffffe06f,
                              CONCAT16(in_stack_ffffffffffffe06e,
                                       CONCAT15(in_stack_ffffffffffffe06d,
                                                CONCAT14(in_stack_ffffffffffffe06c,
                                                         CONCAT13(in_stack_ffffffffffffe06b,
                                                                  CONCAT12(in_stack_ffffffffffffe06a
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffe069,
                                                  in_stack_ffffffffffffe068))))))),(type *)0x1e278a)
  ;
  uVar5 = testing::AssertionResult::operator_cast_to_bool(&local_1d60);
  if (!(bool)uVar5) {
    testing::Message::Message(&local_1d70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1d98,(internal *)&local_1d60,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kTestnet)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1d78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x209,pcVar15);
    testing::internal::AssertHelper::operator=(&local_1d78,&local_1d70);
    testing::internal::AssertHelper::~AssertHelper(&local_1d78);
    std::__cxx11::string::~string((string *)&local_1d98);
    testing::Message::~Message((Message *)0x1e2882);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e28fa);
  uVar6 = cfd::AddressFactory::CheckAddressNetType
                    (in_stack_ffffffffffffe138,
                     (Address *)CONCAT17(in_stack_ffffffffffffe137,in_stack_ffffffffffffe130),
                     in_stack_ffffffffffffe12c);
  local_1da9 = ~uVar6 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(uVar10,CONCAT16(in_stack_ffffffffffffe076,
                                      CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(uVar4,CONCAT12(uVar5,
                                                  CONCAT11(uVar6,in_stack_ffffffffffffe070))))))),
             (bool *)CONCAT17(in_stack_ffffffffffffe06f,
                              CONCAT16(in_stack_ffffffffffffe06e,
                                       CONCAT15(in_stack_ffffffffffffe06d,
                                                CONCAT14(in_stack_ffffffffffffe06c,
                                                         CONCAT13(in_stack_ffffffffffffe06b,
                                                                  CONCAT12(in_stack_ffffffffffffe06a
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffe069,
                                                  in_stack_ffffffffffffe068))))))),(type *)0x1e2942)
  ;
  uVar7 = testing::AssertionResult::operator_cast_to_bool(&local_1da8);
  if (!(bool)uVar7) {
    testing::Message::Message(&local_1db8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1de0,(internal *)&local_1da8,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kRegtest)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1dc0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x20a,pcVar15);
    testing::internal::AssertHelper::operator=(&local_1dc0,&local_1db8);
    testing::internal::AssertHelper::~AssertHelper(&local_1dc0);
    std::__cxx11::string::~string((string *)&local_1de0);
    testing::Message::~Message((Message *)0x1e2a3a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e2ab2);
  uVar8 = cfd::AddressFactory::CheckAddressNetType
                    (in_stack_ffffffffffffe138,
                     (Address *)CONCAT17(in_stack_ffffffffffffe137,in_stack_ffffffffffffe130),
                     in_stack_ffffffffffffe12c);
  local_1df1 = ~uVar8 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(uVar10,CONCAT16(in_stack_ffffffffffffe076,
                                      CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(uVar4,CONCAT12(uVar5,
                                                  CONCAT11(uVar6,uVar7))))))),
             (bool *)CONCAT17(uVar8,CONCAT16(in_stack_ffffffffffffe06e,
                                             CONCAT15(in_stack_ffffffffffffe06d,
                                                      CONCAT14(in_stack_ffffffffffffe06c,
                                                               CONCAT13(in_stack_ffffffffffffe06b,
                                                                        CONCAT12(
                                                  in_stack_ffffffffffffe06a,
                                                  CONCAT11(in_stack_ffffffffffffe069,
                                                           in_stack_ffffffffffffe068))))))),
             (type *)0x1e2afa);
  uVar9 = testing::AssertionResult::operator_cast_to_bool(&local_1df0);
  if (!(bool)uVar9) {
    testing::Message::Message(&local_1e00);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1e28,(internal *)&local_1df0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kLiquidV1)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1e08,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x20b,pcVar15);
    testing::internal::AssertHelper::operator=(&local_1e08,&local_1e00);
    testing::internal::AssertHelper::~AssertHelper(&local_1e08);
    std::__cxx11::string::~string((string *)&local_1e28);
    testing::Message::~Message((Message *)0x1e2bf2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e2c6a);
  uVar11 = cfd::AddressFactory::CheckAddressNetType
                     (in_stack_ffffffffffffe138,
                      (Address *)CONCAT17(in_stack_ffffffffffffe137,in_stack_ffffffffffffe130),
                      in_stack_ffffffffffffe12c);
  local_1e39 = uVar11;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(uVar10,CONCAT16(in_stack_ffffffffffffe076,
                                      CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(uVar4,CONCAT12(uVar5,
                                                  CONCAT11(uVar6,uVar7))))))),
             (bool *)CONCAT17(uVar8,CONCAT16(uVar9,CONCAT15(uVar11,CONCAT14(
                                                  in_stack_ffffffffffffe06c,
                                                  CONCAT13(in_stack_ffffffffffffe06b,
                                                           CONCAT12(in_stack_ffffffffffffe06a,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffe069,
                                                  in_stack_ffffffffffffe068))))))),(type *)0x1e2cb0)
  ;
  uVar12 = testing::AssertionResult::operator_cast_to_bool(&local_1e38);
  if (!(bool)uVar12) {
    testing::Message::Message(&local_1e48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1e70,(internal *)&local_1e38,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kElementsRegtest)",
               "false","true",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1e50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x20c,pcVar15);
    testing::internal::AssertHelper::operator=(&local_1e50,&local_1e48);
    testing::internal::AssertHelper::~AssertHelper(&local_1e50);
    std::__cxx11::string::~string((string *)&local_1e70);
    testing::Message::~Message((Message *)0x1e2da8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e2e20);
  uVar13 = cfd::AddressFactory::CheckAddressNetType
                     (in_stack_ffffffffffffe138,
                      (Address *)CONCAT17(in_stack_ffffffffffffe137,in_stack_ffffffffffffe130),
                      in_stack_ffffffffffffe12c);
  local_1e81 = ~uVar13 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(uVar10,CONCAT16(in_stack_ffffffffffffe076,
                                      CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(uVar4,CONCAT12(uVar5,
                                                  CONCAT11(uVar6,uVar7))))))),
             (bool *)CONCAT17(uVar8,CONCAT16(uVar9,CONCAT15(uVar11,CONCAT14(uVar12,CONCAT13(uVar13,
                                                  CONCAT12(in_stack_ffffffffffffe06a,
                                                           CONCAT11(in_stack_ffffffffffffe069,
                                                                    in_stack_ffffffffffffe068)))))))
             ,(type *)0x1e2e68);
  uVar14 = testing::AssertionResult::operator_cast_to_bool(&local_1e80);
  if (!(bool)uVar14) {
    testing::Message::Message(&local_1e90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1eb8,(internal *)&local_1e80,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kCustomChain)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1e98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x20d,pcVar15);
    testing::internal::AssertHelper::operator=(&local_1e98,&local_1e90);
    testing::internal::AssertHelper::~AssertHelper(&local_1e98);
    std::__cxx11::string::~string((string *)&local_1eb8);
    testing::Message::~Message((Message *)0x1e2f60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e2fd8);
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    (in_stack_ffffffffffffe138,
                     (Address *)CONCAT17(in_stack_ffffffffffffe137,in_stack_ffffffffffffe130),
                     in_stack_ffffffffffffe12c);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(uVar10,CONCAT16(in_stack_ffffffffffffe076,
                                      CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(uVar4,CONCAT12(uVar5,
                                                  CONCAT11(uVar6,uVar7))))))),
             (bool *)CONCAT17(uVar8,CONCAT16(uVar9,CONCAT15(uVar11,CONCAT14(uVar12,CONCAT13(uVar13,
                                                  CONCAT12(uVar14,CONCAT11(bVar1,
                                                  in_stack_ffffffffffffe068))))))),(type *)0x1e3020)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffe138);
  if (!bVar1) {
    testing::Message::Message((Message *)&stack0xffffffffffffe128);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1f00,(internal *)&stack0xffffffffffffe138,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kNetTypeNum)","true",
               "false",in_R9);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1ee0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x20e,pcVar15);
    testing::internal::AssertHelper::operator=(&local_1ee0,(Message *)&stack0xffffffffffffe128);
    testing::internal::AssertHelper::~AssertHelper(&local_1ee0);
    std::__cxx11::string::~string((string *)&local_1f00);
    testing::Message::~Message((Message *)0x1e3116);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e318e);
  cfd::core::Script::~Script
            ((Script *)
             CONCAT17(uVar10,CONCAT16(in_stack_ffffffffffffe076,
                                      CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(uVar4,CONCAT12(uVar5,
                                                  CONCAT11(uVar6,uVar7))))))));
  cfd::core::Address::~Address
            ((Address *)
             CONCAT17(uVar10,CONCAT16(in_stack_ffffffffffffe076,
                                      CONCAT15(uVar2,CONCAT14(uVar3,CONCAT13(uVar4,CONCAT12(uVar5,
                                                  CONCAT11(uVar6,uVar7))))))));
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x1e31b5);
  cfd::AddressFactory::~AddressFactory((AddressFactory *)0x1e31c2);
  return;
}

Assistant:

TEST(AddressFactory, CheckAddressNetType_elements)
{
  AddressFactory factory(NetType::kLiquidV1, GetElementsAddressFormatList());
  Pubkey pubkey("027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af");
  Address addr;
  EXPECT_NO_THROW(addr = factory.CreateP2pkhAddress(pubkey));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kMainnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kTestnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kRegtest));
  EXPECT_TRUE(factory.CheckAddressNetType(addr, NetType::kLiquidV1));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kElementsRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kCustomChain));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kNetTypeNum));

  EXPECT_NO_THROW(addr = factory.CreateP2wpkhAddress(pubkey));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kMainnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kTestnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kRegtest));
  EXPECT_TRUE(factory.CheckAddressNetType(addr, NetType::kLiquidV1));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kElementsRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kCustomChain));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kNetTypeNum));

  Script script = Script("76a914ef286e6af39de178d88b32e120f716b53753808c88ac");
  EXPECT_NO_THROW(addr = factory.CreateP2shAddress(script));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kMainnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kTestnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kRegtest));
  EXPECT_TRUE(factory.CheckAddressNetType(addr, NetType::kLiquidV1));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kElementsRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kCustomChain));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kNetTypeNum));

  EXPECT_NO_THROW(addr = factory.CreateP2wshAddress(script));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kMainnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kTestnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kRegtest));
  EXPECT_TRUE(factory.CheckAddressNetType(addr, NetType::kLiquidV1));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kElementsRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kCustomChain));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kNetTypeNum));

  factory = AddressFactory(NetType::kElementsRegtest, GetElementsAddressFormatList());
  EXPECT_NO_THROW(addr = factory.CreateP2pkhAddress(pubkey));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kMainnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kTestnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kLiquidV1));
  EXPECT_TRUE(factory.CheckAddressNetType(addr, NetType::kElementsRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kCustomChain));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kNetTypeNum));

  EXPECT_NO_THROW(addr = factory.CreateP2wpkhAddress(pubkey));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kMainnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kTestnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kLiquidV1));
  EXPECT_TRUE(factory.CheckAddressNetType(addr, NetType::kElementsRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kCustomChain));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kNetTypeNum));

  EXPECT_NO_THROW(addr = factory.CreateP2shAddress(script));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kMainnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kTestnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kLiquidV1));
  EXPECT_TRUE(factory.CheckAddressNetType(addr, NetType::kElementsRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kCustomChain));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kNetTypeNum));

  EXPECT_NO_THROW(addr = factory.CreateP2wshAddress(script));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kMainnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kTestnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kLiquidV1));
  EXPECT_TRUE(factory.CheckAddressNetType(addr, NetType::kElementsRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kCustomChain));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kNetTypeNum));
}